

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  uint uVar8;
  int iVar9;
  Geometry *pGVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar64;
  float fVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [28];
  undefined1 auVar68 [28];
  ulong uVar69;
  ulong uVar70;
  RTCIntersectArguments *pRVar71;
  ulong uVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  undefined4 uVar76;
  RTCFilterFunctionN p_Var77;
  undefined4 uVar78;
  undefined8 unaff_R13;
  long lVar79;
  undefined8 uVar80;
  float fVar99;
  vint4 bi_2;
  undefined1 auVar81 [16];
  float fVar97;
  float fVar101;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar98;
  float fVar100;
  float fVar102;
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar86 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vint4 bi_1;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar110 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [64];
  vint4 ai_2;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 ai;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [64];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [64];
  float fVar175;
  undefined1 auVar176 [32];
  float fVar178;
  undefined1 auVar177 [64];
  undefined1 auVar179 [16];
  float fVar189;
  float fVar190;
  undefined1 auVar188 [64];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [64];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [64];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  float fVar206;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  float fVar211;
  float fVar212;
  RTCFilterFunctionNArguments args;
  undefined1 local_7a0 [16];
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 (*local_640) [16];
  Precalculations *local_638;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  LinearSpace3fa *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined4 local_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined1 local_470 [16];
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined4 uStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  int local_1e0;
  int local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar180 [16];
  
  PVar7 = prim[1];
  uVar69 = (ulong)(byte)PVar7;
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar12 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar122 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar11 = vsubps_avx(auVar11,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  auVar81._0_4_ = fVar122 * auVar11._0_4_;
  auVar81._4_4_ = fVar122 * auVar11._4_4_;
  auVar81._8_4_ = fVar122 * auVar11._8_4_;
  auVar81._12_4_ = fVar122 * auVar11._12_4_;
  auVar148._0_4_ = fVar122 * auVar12._0_4_;
  auVar148._4_4_ = fVar122 * auVar12._4_4_;
  auVar148._8_4_ = fVar122 * auVar12._8_4_;
  auVar148._12_4_ = fVar122 * auVar12._12_4_;
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 4 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 5 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar13 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 6 + 6)));
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xb + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xc + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0xd + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x12 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x13 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar194 = ZEXT1664(auVar83);
  auVar123 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar69 * 0x14 + 6)));
  auVar123 = vcvtdq2ps_avx(auVar123);
  auVar202._4_4_ = auVar148._0_4_;
  auVar202._0_4_ = auVar148._0_4_;
  auVar202._8_4_ = auVar148._0_4_;
  auVar202._12_4_ = auVar148._0_4_;
  auVar107 = vshufps_avx(auVar148,auVar148,0x55);
  auVar82 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar122 = auVar82._0_4_;
  auVar191._0_4_ = fVar122 * auVar13._0_4_;
  fVar97 = auVar82._4_4_;
  auVar191._4_4_ = fVar97 * auVar13._4_4_;
  fVar99 = auVar82._8_4_;
  auVar191._8_4_ = fVar99 * auVar13._8_4_;
  fVar101 = auVar82._12_4_;
  auVar191._12_4_ = fVar101 * auVar13._12_4_;
  auVar179._0_4_ = auVar16._0_4_ * fVar122;
  auVar179._4_4_ = auVar16._4_4_ * fVar97;
  auVar179._8_4_ = auVar16._8_4_ * fVar99;
  auVar179._12_4_ = auVar16._12_4_ * fVar101;
  auVar167._0_4_ = auVar123._0_4_ * fVar122;
  auVar167._4_4_ = auVar123._4_4_ * fVar97;
  auVar167._8_4_ = auVar123._8_4_ * fVar99;
  auVar167._12_4_ = auVar123._12_4_ * fVar101;
  auVar82 = vfmadd231ps_fma(auVar191,auVar107,auVar12);
  auVar108 = vfmadd231ps_fma(auVar179,auVar107,auVar15);
  auVar107 = vfmadd231ps_fma(auVar167,auVar83,auVar107);
  auVar136 = vfmadd231ps_fma(auVar82,auVar202,auVar11);
  auVar108 = vfmadd231ps_fma(auVar108,auVar202,auVar14);
  auVar142 = vfmadd231ps_fma(auVar107,auVar84,auVar202);
  auVar203._4_4_ = auVar81._0_4_;
  auVar203._0_4_ = auVar81._0_4_;
  auVar203._8_4_ = auVar81._0_4_;
  auVar203._12_4_ = auVar81._0_4_;
  auVar107 = vshufps_avx(auVar81,auVar81,0x55);
  auVar82 = vshufps_avx(auVar81,auVar81,0xaa);
  fVar122 = auVar82._0_4_;
  auVar149._0_4_ = fVar122 * auVar13._0_4_;
  fVar97 = auVar82._4_4_;
  auVar149._4_4_ = fVar97 * auVar13._4_4_;
  fVar99 = auVar82._8_4_;
  auVar149._8_4_ = fVar99 * auVar13._8_4_;
  fVar101 = auVar82._12_4_;
  auVar149._12_4_ = fVar101 * auVar13._12_4_;
  auVar106._0_4_ = auVar16._0_4_ * fVar122;
  auVar106._4_4_ = auVar16._4_4_ * fVar97;
  auVar106._8_4_ = auVar16._8_4_ * fVar99;
  auVar106._12_4_ = auVar16._12_4_ * fVar101;
  auVar82._0_4_ = auVar123._0_4_ * fVar122;
  auVar82._4_4_ = auVar123._4_4_ * fVar97;
  auVar82._8_4_ = auVar123._8_4_ * fVar99;
  auVar82._12_4_ = auVar123._12_4_ * fVar101;
  auVar12 = vfmadd231ps_fma(auVar149,auVar107,auVar12);
  auVar13 = vfmadd231ps_fma(auVar106,auVar107,auVar15);
  auVar15 = vfmadd231ps_fma(auVar82,auVar107,auVar83);
  auVar16 = vfmadd231ps_fma(auVar12,auVar203,auVar11);
  auVar83 = vfmadd231ps_fma(auVar13,auVar203,auVar14);
  auVar123 = vfmadd231ps_fma(auVar15,auVar203,auVar84);
  local_2d0._8_4_ = 0x7fffffff;
  local_2d0._0_8_ = 0x7fffffff7fffffff;
  local_2d0._12_4_ = 0x7fffffff;
  auVar11 = vandps_avx(auVar136,local_2d0);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  auVar11 = vcmpps_avx(auVar11,auVar141,1);
  auVar12 = vblendvps_avx(auVar136,auVar141,auVar11);
  auVar11 = vandps_avx(auVar108,local_2d0);
  auVar11 = vcmpps_avx(auVar11,auVar141,1);
  auVar13 = vblendvps_avx(auVar108,auVar141,auVar11);
  auVar11 = vandps_avx(local_2d0,auVar142);
  auVar11 = vcmpps_avx(auVar11,auVar141,1);
  auVar11 = vblendvps_avx(auVar142,auVar141,auVar11);
  auVar14 = vrcpps_avx(auVar12);
  auVar168._8_4_ = 0x3f800000;
  auVar168._0_8_ = 0x3f8000003f800000;
  auVar168._12_4_ = 0x3f800000;
  auVar12 = vfnmadd213ps_fma(auVar12,auVar14,auVar168);
  auVar14 = vfmadd132ps_fma(auVar12,auVar14,auVar14);
  auVar12 = vrcpps_avx(auVar13);
  auVar13 = vfnmadd213ps_fma(auVar13,auVar12,auVar168);
  auVar15 = vfmadd132ps_fma(auVar13,auVar12,auVar12);
  auVar12 = vrcpps_avx(auVar11);
  auVar11 = vfnmadd213ps_fma(auVar11,auVar12,auVar168);
  auVar84 = vfmadd132ps_fma(auVar11,auVar12,auVar12);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar69 * 7 + 6);
  auVar11 = vpmovsxwd_avx(auVar11);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar142._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar142._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar142._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar142._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar69 * 9 + 6);
  auVar11 = vpmovsxwd_avx(auVar12);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar16);
  auVar150._0_4_ = auVar14._0_4_ * auVar11._0_4_;
  auVar150._4_4_ = auVar14._4_4_ * auVar11._4_4_;
  auVar150._8_4_ = auVar14._8_4_ * auVar11._8_4_;
  auVar150._12_4_ = auVar14._12_4_ * auVar11._12_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar69 * 0xe + 6);
  auVar11 = vpmovsxwd_avx(auVar13);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar83);
  auVar160._0_4_ = auVar15._0_4_ * auVar11._0_4_;
  auVar160._4_4_ = auVar15._4_4_ * auVar11._4_4_;
  auVar160._8_4_ = auVar15._8_4_ * auVar11._8_4_;
  auVar160._12_4_ = auVar15._12_4_ * auVar11._12_4_;
  auVar108._1_3_ = 0;
  auVar108[0] = PVar7;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar11 = vpmovsxwd_avx(auVar14);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar83);
  auVar107._0_4_ = auVar15._0_4_ * auVar11._0_4_;
  auVar107._4_4_ = auVar15._4_4_ * auVar11._4_4_;
  auVar107._8_4_ = auVar15._8_4_ * auVar11._8_4_;
  auVar107._12_4_ = auVar15._12_4_ * auVar11._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar69 * 0x15 + 6);
  auVar11 = vpmovsxwd_avx(auVar15);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar123);
  auVar136._0_4_ = auVar84._0_4_ * auVar11._0_4_;
  auVar136._4_4_ = auVar84._4_4_ * auVar11._4_4_;
  auVar136._8_4_ = auVar84._8_4_ * auVar11._8_4_;
  auVar136._12_4_ = auVar84._12_4_ * auVar11._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar69 * 0x17 + 6);
  auVar11 = vpmovsxwd_avx(auVar16);
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar11 = vsubps_avx(auVar11,auVar123);
  auVar83._0_4_ = auVar84._0_4_ * auVar11._0_4_;
  auVar83._4_4_ = auVar84._4_4_ * auVar11._4_4_;
  auVar83._8_4_ = auVar84._8_4_ * auVar11._8_4_;
  auVar83._12_4_ = auVar84._12_4_ * auVar11._12_4_;
  auVar11 = vpminsd_avx(auVar142,auVar150);
  auVar12 = vpminsd_avx(auVar160,auVar107);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  auVar12 = vpminsd_avx(auVar136,auVar83);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar180._4_4_ = uVar78;
  auVar180._0_4_ = uVar78;
  auVar180._8_4_ = uVar78;
  auVar180._12_4_ = uVar78;
  auVar188 = ZEXT1664(auVar180);
  auVar12 = vmaxps_avx(auVar12,auVar180);
  auVar11 = vmaxps_avx(auVar11,auVar12);
  local_2e0._0_4_ = auVar11._0_4_ * 0.99999964;
  local_2e0._4_4_ = auVar11._4_4_ * 0.99999964;
  local_2e0._8_4_ = auVar11._8_4_ * 0.99999964;
  local_2e0._12_4_ = auVar11._12_4_ * 0.99999964;
  auVar11 = vpmaxsd_avx(auVar142,auVar150);
  auVar12 = vpmaxsd_avx(auVar160,auVar107);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar12 = vpmaxsd_avx(auVar136,auVar83);
  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar123._4_4_ = uVar78;
  auVar123._0_4_ = uVar78;
  auVar123._8_4_ = uVar78;
  auVar123._12_4_ = uVar78;
  auVar12 = vminps_avx(auVar12,auVar123);
  auVar11 = vminps_avx(auVar11,auVar12);
  auVar84._0_4_ = auVar11._0_4_ * 1.0000004;
  auVar84._4_4_ = auVar11._4_4_ * 1.0000004;
  auVar84._8_4_ = auVar11._8_4_ * 1.0000004;
  auVar84._12_4_ = auVar11._12_4_ * 1.0000004;
  auVar108[4] = PVar7;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar7;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar7;
  auVar108._13_3_ = 0;
  auVar12 = vpcmpgtd_avx(auVar108,_DAT_01f4ad30);
  auVar11 = vcmpps_avx(local_2e0,auVar84,2);
  auVar11 = vandps_avx(auVar11,auVar12);
  uVar78 = vmovmskps_avx(auVar11);
  local_508 = pre->ray_space + k;
  local_500 = mm_lookupmask_ps._16_8_;
  uStack_4f8 = mm_lookupmask_ps._24_8_;
  uStack_4f0 = mm_lookupmask_ps._16_8_;
  uStack_4e8 = mm_lookupmask_ps._24_8_;
  local_640 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_638 = pre;
  for (uVar69 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar78); uVar69 != 0;
      uVar69 = (ulong)((uint)uVar69 & (uint)uVar69 + 0xf & uVar73)) {
    local_780 = auVar188._0_32_;
    local_720 = auVar194._0_32_;
    lVar79 = 0;
    for (uVar70 = uVar69; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      lVar79 = lVar79 + 1;
    }
    uVar73 = *(uint *)(prim + 2);
    local_788 = (ulong)uVar73;
    uVar8 = *(uint *)(prim + lVar79 * 4 + 6);
    pGVar10 = (context->scene->geometries).items[local_788].ptr;
    uVar70 = (ulong)*(uint *)(*(long *)&pGVar10->field_0x58 +
                             (ulong)uVar8 *
                             pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar75 = (long)pGVar10[1].intersectionFilterN * uVar70;
    p_Var77 = pGVar10[2].intersectionFilterN;
    lVar74 = (long)pGVar10[1].intersectionFilterN * (uVar70 + 1);
    lVar79 = *(long *)&pGVar10[1].time_range.upper;
    local_5b0 = *(undefined1 (*) [16])(lVar79 + lVar75);
    _local_4e0 = *(undefined1 (*) [16])(lVar79 + lVar74);
    auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    uVar78 = *(undefined4 *)(lVar79 + 0xc + lVar75);
    auVar169._4_4_ = uVar78;
    auVar169._0_4_ = uVar78;
    auVar169._8_4_ = uVar78;
    auVar169._12_4_ = uVar78;
    local_260._16_4_ = uVar78;
    local_260._0_16_ = auVar169;
    local_260._20_4_ = uVar78;
    local_260._24_4_ = uVar78;
    local_260._28_4_ = uVar78;
    iVar9 = (int)pGVar10[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar11 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar85._8_4_ = 0xbeaaaaab;
    auVar85._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar85._12_4_ = 0xbeaaaaab;
    local_650 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                  (p_Var77 + uVar70 * (long)pGVar10[2].pointQueryFunc),local_5b0,
                                 auVar85);
    local_660 = vfmadd132ps_fma(*(undefined1 (*) [16])
                                 (p_Var77 + (long)pGVar10[2].pointQueryFunc * (uVar70 + 1)),
                                _local_4e0,auVar85);
    auVar13 = vsubps_avx(local_5b0,auVar11);
    uVar78 = auVar13._0_4_;
    auVar109._4_4_ = uVar78;
    auVar109._0_4_ = uVar78;
    auVar109._8_4_ = uVar78;
    auVar109._12_4_ = uVar78;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    aVar5 = (local_508->vx).field_0;
    aVar6 = (local_508->vy).field_0;
    fVar122 = (local_508->vz).field_0.m128[0];
    fVar97 = *(float *)((long)&(local_508->vz).field_0 + 4);
    fVar99 = *(float *)((long)&(local_508->vz).field_0 + 8);
    fVar101 = *(float *)((long)&(local_508->vz).field_0 + 0xc);
    auVar151._0_4_ = fVar122 * auVar13._0_4_;
    auVar151._4_4_ = fVar97 * auVar13._4_4_;
    auVar151._8_4_ = fVar99 * auVar13._8_4_;
    auVar151._12_4_ = fVar101 * auVar13._12_4_;
    auVar12 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar6,auVar12);
    auVar16 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar109);
    auVar14 = vinsertps_avx(auVar16,auVar169,0x30);
    auVar13 = vsubps_avx(local_650,auVar11);
    uVar78 = auVar13._0_4_;
    auVar152._4_4_ = uVar78;
    auVar152._0_4_ = uVar78;
    auVar152._8_4_ = uVar78;
    auVar152._12_4_ = uVar78;
    auVar12 = vshufps_avx(auVar13,auVar13,0x55);
    auVar13 = vshufps_avx(auVar13,auVar13,0xaa);
    auVar181._0_4_ = fVar122 * auVar13._0_4_;
    auVar181._4_4_ = fVar97 * auVar13._4_4_;
    auVar181._8_4_ = fVar99 * auVar13._8_4_;
    auVar181._12_4_ = fVar101 * auVar13._12_4_;
    auVar12 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar6,auVar12);
    auVar84 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar152);
    auVar12 = vblendps_avx(auVar84,local_650,8);
    auVar15 = vsubps_avx(local_660,auVar11);
    uVar78 = auVar15._0_4_;
    auVar170._4_4_ = uVar78;
    auVar170._0_4_ = uVar78;
    auVar170._8_4_ = uVar78;
    auVar170._12_4_ = uVar78;
    auVar13 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar182._0_4_ = fVar122 * auVar15._0_4_;
    auVar182._4_4_ = fVar97 * auVar15._4_4_;
    auVar182._8_4_ = fVar99 * auVar15._8_4_;
    auVar182._12_4_ = fVar101 * auVar15._12_4_;
    auVar13 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar6,auVar13);
    auVar83 = vfmadd231ps_fma(auVar13,(undefined1  [16])aVar5,auVar170);
    auVar13 = vblendps_avx(auVar83,local_660,8);
    auVar15 = vsubps_avx(_local_4e0,auVar11);
    auVar11 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar171._0_4_ = fVar122 * auVar11._0_4_;
    auVar171._4_4_ = fVar97 * auVar11._4_4_;
    auVar171._8_4_ = fVar99 * auVar11._8_4_;
    auVar171._12_4_ = fVar101 * auVar11._12_4_;
    uVar78 = auVar15._0_4_;
    auVar161._4_4_ = uVar78;
    auVar161._0_4_ = uVar78;
    auVar161._8_4_ = uVar78;
    auVar161._12_4_ = uVar78;
    auVar11 = vshufps_avx(auVar15,auVar15,0x55);
    auVar11 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar6,auVar11);
    fVar122 = *(float *)(lVar79 + 0xc + lVar74);
    auVar124._4_4_ = fVar122;
    auVar124._0_4_ = fVar122;
    auVar124._8_4_ = fVar122;
    auVar124._12_4_ = fVar122;
    fStack_270 = fVar122;
    _local_280 = auVar124;
    fStack_26c = fVar122;
    fStack_268 = fVar122;
    uStack_264 = fVar122;
    auVar123 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar5,auVar161);
    auVar15 = vinsertps_avx(auVar123,auVar124,0x30);
    auVar11 = vandps_avx(auVar14,local_2d0);
    auVar12 = vandps_avx(auVar12,local_2d0);
    auVar14 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vandps_avx(auVar13,local_2d0);
    auVar12 = vandps_avx(auVar15,local_2d0);
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar11 = vmaxps_avx(auVar14,auVar11);
    auVar12 = vmovshdup_avx(auVar11);
    auVar12 = vmaxss_avx(auVar12,auVar11);
    auVar11 = vshufpd_avx(auVar11,auVar11,1);
    auVar11 = vmaxss_avx(auVar11,auVar12);
    lVar79 = (long)iVar9 * 0x44;
    auVar12 = vmovshdup_avx(auVar16);
    uVar80 = auVar12._0_8_;
    local_540._8_8_ = uVar80;
    local_540._0_8_ = uVar80;
    local_540._16_8_ = uVar80;
    local_540._24_8_ = uVar80;
    auVar12 = vmovshdup_avx(auVar84);
    uVar80 = auVar12._0_8_;
    local_700._8_8_ = uVar80;
    local_700._0_8_ = uVar80;
    local_700._16_8_ = uVar80;
    local_700._24_8_ = uVar80;
    auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x908);
    auVar12 = vmovshdup_avx(auVar83);
    uVar80 = auVar12._0_8_;
    local_6c0._8_8_ = uVar80;
    local_6c0._0_8_ = uVar80;
    local_6c0._16_8_ = uVar80;
    local_6c0._24_8_ = uVar80;
    auVar12 = vmovshdup_avx(auVar123);
    local_680 = auVar12._0_8_;
    uVar76 = auVar83._0_4_;
    local_760._4_4_ = uVar76;
    local_760._0_4_ = uVar76;
    local_760._8_4_ = uVar76;
    local_760._12_4_ = uVar76;
    local_760._16_4_ = uVar76;
    local_760._20_4_ = uVar76;
    local_760._24_4_ = uVar76;
    local_760._28_4_ = uVar76;
    pauVar1 = (undefined1 (*) [32])(bezier_basis0 + lVar79 + 0xd8c);
    fVar97 = *(float *)*pauVar1;
    fVar99 = *(float *)(bezier_basis0 + lVar79 + 0xd90);
    fVar101 = *(float *)(bezier_basis0 + lVar79 + 0xd94);
    fVar189 = *(float *)(bezier_basis0 + lVar79 + 0xd98);
    fVar190 = *(float *)(bezier_basis0 + lVar79 + 0xd9c);
    fVar121 = *(float *)(bezier_basis0 + lVar79 + 0xda0);
    fVar98 = *(float *)(bezier_basis0 + lVar79 + 0xda4);
    auVar67 = *(undefined1 (*) [28])*pauVar1;
    local_6a0 = auVar123._0_4_;
    auVar145._0_4_ = fVar97 * local_6a0;
    auVar145._4_4_ = fVar99 * local_6a0;
    auVar145._8_4_ = fVar101 * local_6a0;
    auVar145._12_4_ = fVar189 * local_6a0;
    auVar145._16_4_ = fVar190 * local_6a0;
    auVar145._20_4_ = fVar121 * local_6a0;
    auVar145._24_4_ = fVar98 * local_6a0;
    auVar145._28_4_ = 0;
    auVar13 = vfmadd231ps_fma(auVar145,auVar118,local_760);
    fVar211 = auVar12._0_4_;
    auVar131._0_4_ = fVar211 * fVar97;
    fVar212 = auVar12._4_4_;
    auVar131._4_4_ = fVar212 * fVar99;
    auVar131._8_4_ = fVar211 * fVar101;
    auVar131._12_4_ = fVar212 * fVar189;
    auVar131._16_4_ = fVar211 * fVar190;
    auVar131._20_4_ = fVar212 * fVar121;
    auVar131._24_4_ = fVar211 * fVar98;
    auVar131._28_4_ = 0;
    auVar12 = vfmadd231ps_fma(auVar131,auVar118,local_6c0);
    auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x484);
    uVar78 = auVar84._0_4_;
    auVar172._4_4_ = uVar78;
    auVar172._0_4_ = uVar78;
    auVar172._8_4_ = uVar78;
    auVar172._12_4_ = uVar78;
    auVar172._16_4_ = uVar78;
    auVar172._20_4_ = uVar78;
    auVar172._24_4_ = uVar78;
    auVar172._28_4_ = uVar78;
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar131,auVar172);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar131,local_700);
    auVar145 = *(undefined1 (*) [32])(bezier_basis0 + lVar79);
    uVar78 = auVar16._0_4_;
    local_6e0._4_4_ = uVar78;
    local_6e0._0_4_ = uVar78;
    local_6e0._8_4_ = uVar78;
    local_6e0._12_4_ = uVar78;
    local_6e0._16_4_ = uVar78;
    local_6e0._20_4_ = uVar78;
    local_6e0._24_4_ = uVar78;
    local_6e0._28_4_ = uVar78;
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar145,local_6e0);
    auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar145,local_540);
    auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x908);
    fVar100 = *(float *)(bezier_basis1 + lVar79 + 0xd8c);
    fVar102 = *(float *)(bezier_basis1 + lVar79 + 0xd90);
    fVar103 = *(float *)(bezier_basis1 + lVar79 + 0xd94);
    fVar104 = *(float *)(bezier_basis1 + lVar79 + 0xd98);
    fVar105 = *(float *)(bezier_basis1 + lVar79 + 0xd9c);
    fVar64 = *(float *)(bezier_basis1 + lVar79 + 0xda0);
    fVar65 = *(float *)(bezier_basis1 + lVar79 + 0xda4);
    auVar116._4_4_ = fVar102 * local_6a0;
    auVar116._0_4_ = fVar100 * local_6a0;
    auVar116._8_4_ = fVar103 * local_6a0;
    auVar116._12_4_ = fVar104 * local_6a0;
    auVar116._16_4_ = fVar105 * local_6a0;
    auVar116._20_4_ = fVar64 * local_6a0;
    auVar116._24_4_ = fVar65 * local_6a0;
    auVar116._28_4_ = local_6a0;
    auVar14 = vfmadd231ps_fma(auVar116,auVar94,local_760);
    auVar156._4_4_ = fVar212 * fVar102;
    auVar156._0_4_ = fVar211 * fVar100;
    auVar156._8_4_ = fVar211 * fVar103;
    auVar156._12_4_ = fVar212 * fVar104;
    auVar156._16_4_ = fVar211 * fVar105;
    auVar156._20_4_ = fVar212 * fVar64;
    auVar156._24_4_ = fVar211 * fVar65;
    auVar156._28_4_ = uVar76;
    auVar15 = vfmadd231ps_fma(auVar156,auVar94,local_6c0);
    auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x484);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,auVar172);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,local_700);
    auVar156 = *(undefined1 (*) [32])(bezier_basis1 + lVar79);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar156,local_6e0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar156,local_540);
    auVar87 = ZEXT1632(auVar14);
    _local_340 = ZEXT1632(auVar13);
    local_380 = vsubps_avx(auVar87,_local_340);
    _local_320 = ZEXT1632(auVar15);
    local_360 = ZEXT1632(auVar12);
    local_3a0 = vsubps_avx(_local_320,local_360);
    auVar88._0_4_ = local_380._0_4_ * auVar12._0_4_;
    auVar88._4_4_ = local_380._4_4_ * auVar12._4_4_;
    auVar88._8_4_ = local_380._8_4_ * auVar12._8_4_;
    auVar88._12_4_ = local_380._12_4_ * auVar12._12_4_;
    auVar88._16_4_ = local_380._16_4_ * 0.0;
    auVar88._20_4_ = local_380._20_4_ * 0.0;
    auVar88._24_4_ = local_380._24_4_ * 0.0;
    auVar88._28_4_ = 0;
    fVar175 = local_3a0._0_4_;
    auVar112._0_4_ = fVar175 * auVar13._0_4_;
    fVar178 = local_3a0._4_4_;
    auVar112._4_4_ = fVar178 * auVar13._4_4_;
    fVar206 = local_3a0._8_4_;
    auVar112._8_4_ = fVar206 * auVar13._8_4_;
    fVar207 = local_3a0._12_4_;
    auVar112._12_4_ = fVar207 * auVar13._12_4_;
    fVar208 = local_3a0._16_4_;
    auVar112._16_4_ = fVar208 * 0.0;
    fVar209 = local_3a0._20_4_;
    auVar112._20_4_ = fVar209 * 0.0;
    fVar210 = local_3a0._24_4_;
    auVar112._24_4_ = fVar210 * 0.0;
    auVar112._28_4_ = 0;
    auVar88 = vsubps_avx(auVar88,auVar112);
    auVar12 = vpermilps_avx(local_650,0xff);
    uVar80 = auVar12._0_8_;
    local_80._8_8_ = uVar80;
    local_80._0_8_ = uVar80;
    local_80._16_8_ = uVar80;
    local_80._24_8_ = uVar80;
    auVar13 = vpermilps_avx(local_660,0xff);
    local_a0._0_8_ = auVar13._0_8_;
    local_a0._8_8_ = local_a0._0_8_;
    local_a0._16_8_ = local_a0._0_8_;
    local_a0._24_8_ = local_a0._0_8_;
    auVar187._4_4_ = fVar99 * fVar122;
    auVar187._0_4_ = fVar97 * fVar122;
    auVar187._8_4_ = fVar101 * fVar122;
    auVar187._12_4_ = fVar189 * fVar122;
    auVar187._16_4_ = fVar190 * fVar122;
    auVar187._20_4_ = fVar121 * fVar122;
    auVar187._24_4_ = fVar98 * fVar122;
    auVar187._28_4_ = *(undefined4 *)(bezier_basis0 + lVar79 + 0xda8);
    auVar13 = vfmadd231ps_fma(auVar187,auVar118,local_a0);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar131,local_80);
    auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar145,local_260);
    auVar96._4_4_ = fVar102 * fVar122;
    auVar96._0_4_ = fVar100 * fVar122;
    auVar96._8_4_ = fVar103 * fVar122;
    auVar96._12_4_ = fVar104 * fVar122;
    auVar96._16_4_ = fVar105 * fVar122;
    auVar96._20_4_ = fVar64 * fVar122;
    auVar96._24_4_ = fVar65 * fVar122;
    auVar96._28_4_ = auVar145._28_4_;
    auVar14 = vfmadd231ps_fma(auVar96,auVar94,local_a0);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar116,local_80);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar156,local_260);
    auVar166 = ZEXT1664(auVar14);
    auVar183._4_4_ = fVar178 * fVar178;
    auVar183._0_4_ = fVar175 * fVar175;
    auVar183._8_4_ = fVar206 * fVar206;
    auVar183._12_4_ = fVar207 * fVar207;
    auVar183._16_4_ = fVar208 * fVar208;
    auVar183._20_4_ = fVar209 * fVar209;
    auVar183._24_4_ = fVar210 * fVar210;
    auVar183._28_4_ = auVar12._4_4_;
    auVar12 = vfmadd231ps_fma(auVar183,local_380,local_380);
    auVar187 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar14));
    auVar200._4_4_ = auVar187._4_4_ * auVar187._4_4_ * auVar12._4_4_;
    auVar200._0_4_ = auVar187._0_4_ * auVar187._0_4_ * auVar12._0_4_;
    auVar200._8_4_ = auVar187._8_4_ * auVar187._8_4_ * auVar12._8_4_;
    auVar200._12_4_ = auVar187._12_4_ * auVar187._12_4_ * auVar12._12_4_;
    auVar200._16_4_ = auVar187._16_4_ * auVar187._16_4_ * 0.0;
    auVar200._20_4_ = auVar187._20_4_ * auVar187._20_4_ * 0.0;
    auVar200._24_4_ = auVar187._24_4_ * auVar187._24_4_ * 0.0;
    auVar200._28_4_ = auVar187._28_4_;
    auVar18._4_4_ = auVar88._4_4_ * auVar88._4_4_;
    auVar18._0_4_ = auVar88._0_4_ * auVar88._0_4_;
    auVar18._8_4_ = auVar88._8_4_ * auVar88._8_4_;
    auVar18._12_4_ = auVar88._12_4_ * auVar88._12_4_;
    auVar18._16_4_ = auVar88._16_4_ * auVar88._16_4_;
    auVar18._20_4_ = auVar88._20_4_ * auVar88._20_4_;
    auVar18._24_4_ = auVar88._24_4_ * auVar88._24_4_;
    auVar18._28_4_ = auVar88._28_4_;
    auVar187 = vcmpps_avx(auVar18,auVar200,2);
    fVar122 = auVar11._0_4_ * 4.7683716e-07;
    auVar89._0_4_ = (float)iVar9;
    register0x00001444 = auVar83._4_12_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    auVar88 = vcmpps_avx(_DAT_01f7b060,auVar89,1);
    auVar11 = vpermilps_avx(auVar16,0xaa);
    uVar80 = auVar11._0_8_;
    auVar146._8_8_ = uVar80;
    auVar146._0_8_ = uVar80;
    auVar146._16_8_ = uVar80;
    auVar146._24_8_ = uVar80;
    auVar11 = vpermilps_avx(auVar84,0xaa);
    uVar80 = auVar11._0_8_;
    local_3e0._8_8_ = uVar80;
    local_3e0._0_8_ = uVar80;
    local_3e0._16_8_ = uVar80;
    local_3e0._24_8_ = uVar80;
    auVar11 = vshufps_avx(auVar83,auVar83,0xaa);
    uVar80 = auVar11._0_8_;
    local_c0._8_8_ = uVar80;
    local_c0._0_8_ = uVar80;
    local_c0._16_8_ = uVar80;
    local_c0._24_8_ = uVar80;
    auVar11 = vpermilps_avx(auVar123,0xaa);
    uVar80 = auVar11._0_8_;
    register0x00001408 = uVar80;
    local_5a0 = uVar80;
    register0x00001410 = uVar80;
    register0x00001418 = uVar80;
    auVar96 = auVar88 & auVar187;
    local_5e0._0_16_ = ZEXT416(uVar8);
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x30);
    fVar97 = fVar211;
    fVar99 = fVar212;
    fVar101 = fVar211;
    fVar189 = fVar212;
    fVar190 = fVar211;
    fStack_69c = local_6a0;
    fStack_698 = local_6a0;
    fStack_694 = local_6a0;
    fStack_690 = local_6a0;
    fStack_68c = local_6a0;
    fStack_688 = local_6a0;
    fStack_684 = local_6a0;
    uStack_678 = local_680;
    uStack_670 = local_680;
    uStack_668 = local_680;
    local_5c0._0_4_ = auVar89._0_4_;
    if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar96 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar96 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar96 >> 0x7f,0) == '\0') &&
          (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar96 >> 0xbf,0) == '\0') &&
        (auVar96 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar96[0x1f]) {
LAB_01150b64:
      auVar205 = ZEXT3264(local_760);
      auVar201 = ZEXT3264(local_6c0);
      auVar198 = ZEXT3264(_local_5a0);
      auVar194 = ZEXT3264(local_720);
      auVar188 = ZEXT3264(local_780);
      p_Var77 = (RTCFilterFunctionN)0x0;
      auVar174 = ZEXT3264(CONCAT428(local_6a0,
                                    CONCAT424(local_6a0,
                                              CONCAT420(local_6a0,
                                                        CONCAT416(local_6a0,
                                                                  CONCAT412(local_6a0,
                                                                            CONCAT48(local_6a0,
                                                                                     CONCAT44(
                                                  local_6a0,local_6a0))))))));
      auVar120 = ZEXT3264(local_700);
      auVar177 = ZEXT3264(local_6e0);
    }
    else {
      _local_400 = vandps_avx(auVar187,auVar88);
      fVar175 = auVar11._0_4_;
      fVar178 = auVar11._4_4_;
      auVar17._4_4_ = fVar178 * fVar102;
      auVar17._0_4_ = fVar175 * fVar100;
      auVar17._8_4_ = fVar175 * fVar103;
      auVar17._12_4_ = fVar178 * fVar104;
      auVar17._16_4_ = fVar175 * fVar105;
      auVar17._20_4_ = fVar178 * fVar64;
      auVar17._24_4_ = fVar175 * fVar65;
      auVar17._28_4_ = local_400._28_4_;
      auVar11 = vfmadd213ps_fma(auVar94,local_c0,auVar17);
      auVar11 = vfmadd213ps_fma(auVar116,local_3e0,ZEXT1632(auVar11));
      auVar11 = vfmadd213ps_fma(auVar156,auVar146,ZEXT1632(auVar11));
      local_3c0._0_4_ = auVar67._0_4_;
      local_3c0._4_4_ = auVar67._4_4_;
      fStack_3b8 = auVar67._8_4_;
      fStack_3b4 = auVar67._12_4_;
      fStack_3b0 = auVar67._16_4_;
      fStack_3ac = auVar67._20_4_;
      fStack_3a8 = auVar67._24_4_;
      auVar90._0_4_ = fVar175 * (float)local_3c0._0_4_;
      auVar90._4_4_ = fVar178 * (float)local_3c0._4_4_;
      auVar90._8_4_ = fVar175 * fStack_3b8;
      auVar90._12_4_ = fVar178 * fStack_3b4;
      auVar90._16_4_ = fVar175 * fStack_3b0;
      auVar90._20_4_ = fVar178 * fStack_3ac;
      auVar90._24_4_ = fVar175 * fStack_3a8;
      auVar90._28_4_ = 0;
      auVar12 = vfmadd213ps_fma(auVar118,local_c0,auVar90);
      auVar12 = vfmadd213ps_fma(auVar131,local_3e0,ZEXT1632(auVar12));
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1210);
      auVar131 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1694);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1b18);
      fVar121 = *(float *)(bezier_basis0 + lVar79 + 0x1f9c);
      fVar98 = *(float *)(bezier_basis0 + lVar79 + 0x1fa0);
      fVar100 = *(float *)(bezier_basis0 + lVar79 + 0x1fa4);
      fVar102 = *(float *)(bezier_basis0 + lVar79 + 0x1fa8);
      fVar103 = *(float *)(bezier_basis0 + lVar79 + 0x1fac);
      fVar104 = *(float *)(bezier_basis0 + lVar79 + 0x1fb0);
      fVar105 = *(float *)(bezier_basis0 + lVar79 + 0x1fb4);
      auVar155._0_4_ = local_6a0 * fVar121;
      auVar155._4_4_ = local_6a0 * fVar98;
      auVar155._8_4_ = local_6a0 * fVar100;
      auVar155._12_4_ = local_6a0 * fVar102;
      auVar155._16_4_ = local_6a0 * fVar103;
      auVar155._20_4_ = local_6a0 * fVar104;
      auVar155._24_4_ = local_6a0 * fVar105;
      auVar155._28_4_ = 0;
      auVar199._4_4_ = fVar212 * fVar98;
      auVar199._0_4_ = fVar211 * fVar121;
      auVar199._8_4_ = fVar211 * fVar100;
      auVar199._12_4_ = fVar212 * fVar102;
      auVar199._16_4_ = fVar211 * fVar103;
      auVar199._20_4_ = fVar212 * fVar104;
      auVar199._24_4_ = fVar211 * fVar105;
      auVar199._28_4_ = fVar178;
      auVar20._4_4_ = fVar98 * fVar178;
      auVar20._0_4_ = fVar121 * fVar175;
      auVar20._8_4_ = fVar100 * fVar175;
      auVar20._12_4_ = fVar102 * fVar178;
      auVar20._16_4_ = fVar103 * fVar175;
      auVar20._20_4_ = fVar104 * fVar178;
      auVar20._24_4_ = fVar105 * fVar175;
      auVar20._28_4_ = *(undefined4 *)(bezier_basis1 + lVar79 + 0xda8);
      auVar15 = vfmadd231ps_fma(auVar155,auVar94,local_760);
      auVar16 = vfmadd231ps_fma(auVar199,auVar94,local_6c0);
      auVar84 = vfmadd231ps_fma(auVar20,local_c0,auVar94);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar131,auVar172);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar131,local_700);
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),local_3e0,auVar131);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar118,local_6e0);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar118,local_540);
      auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar118,auVar146);
      fVar121 = *(float *)(bezier_basis1 + lVar79 + 0x1f9c);
      fVar98 = *(float *)(bezier_basis1 + lVar79 + 0x1fa0);
      fVar100 = *(float *)(bezier_basis1 + lVar79 + 0x1fa4);
      fVar102 = *(float *)(bezier_basis1 + lVar79 + 0x1fa8);
      fVar103 = *(float *)(bezier_basis1 + lVar79 + 0x1fac);
      fVar104 = *(float *)(bezier_basis1 + lVar79 + 0x1fb0);
      fVar105 = *(float *)(bezier_basis1 + lVar79 + 0x1fb4);
      auVar94._4_4_ = local_6a0 * fVar98;
      auVar94._0_4_ = local_6a0 * fVar121;
      auVar94._8_4_ = local_6a0 * fVar100;
      auVar94._12_4_ = local_6a0 * fVar102;
      auVar94._16_4_ = local_6a0 * fVar103;
      auVar94._20_4_ = local_6a0 * fVar104;
      auVar94._24_4_ = local_6a0 * fVar105;
      auVar94._28_4_ = auVar118._28_4_;
      auVar21._4_4_ = fVar212 * fVar98;
      auVar21._0_4_ = fVar211 * fVar121;
      auVar21._8_4_ = fVar211 * fVar100;
      auVar21._12_4_ = fVar212 * fVar102;
      auVar21._16_4_ = fVar211 * fVar103;
      auVar21._20_4_ = fVar212 * fVar104;
      auVar21._24_4_ = fVar211 * fVar105;
      auVar21._28_4_ = local_6a0;
      auVar22._4_4_ = fVar178 * fVar98;
      auVar22._0_4_ = fVar175 * fVar121;
      auVar22._8_4_ = fVar175 * fVar100;
      auVar22._12_4_ = fVar178 * fVar102;
      auVar22._16_4_ = fVar175 * fVar103;
      auVar22._20_4_ = fVar178 * fVar104;
      auVar22._24_4_ = fVar175 * fVar105;
      auVar22._28_4_ = fVar178;
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1b18);
      auVar83 = vfmadd231ps_fma(auVar94,auVar118,local_760);
      auVar123 = vfmadd231ps_fma(auVar21,auVar118,local_6c0);
      auVar107 = vfmadd231ps_fma(auVar22,local_c0,auVar118);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1694);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar118,auVar172);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar118,local_700);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_3e0,auVar118);
      auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1210);
      auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar118,local_6e0);
      auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar118,local_540);
      auVar113._8_4_ = 0x7fffffff;
      auVar113._0_8_ = 0x7fffffff7fffffff;
      auVar113._12_4_ = 0x7fffffff;
      auVar113._16_4_ = 0x7fffffff;
      auVar113._20_4_ = 0x7fffffff;
      auVar113._24_4_ = 0x7fffffff;
      auVar113._28_4_ = 0x7fffffff;
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar146,auVar118);
      auVar118 = vandps_avx(ZEXT1632(auVar15),auVar113);
      auVar131 = vandps_avx(ZEXT1632(auVar16),auVar113);
      auVar131 = vmaxps_avx(auVar118,auVar131);
      auVar118 = vandps_avx(ZEXT1632(auVar84),auVar113);
      auVar118 = vmaxps_avx(auVar131,auVar118);
      auVar132._4_4_ = fVar122;
      auVar132._0_4_ = fVar122;
      auVar132._8_4_ = fVar122;
      auVar132._12_4_ = fVar122;
      auVar132._16_4_ = fVar122;
      auVar132._20_4_ = fVar122;
      auVar132._24_4_ = fVar122;
      auVar132._28_4_ = fVar122;
      auVar118 = vcmpps_avx(auVar118,auVar132,1);
      auVar94 = vblendvps_avx(ZEXT1632(auVar15),local_380,auVar118);
      auVar116 = vblendvps_avx(ZEXT1632(auVar16),local_3a0,auVar118);
      auVar118 = vandps_avx(ZEXT1632(auVar83),auVar113);
      auVar131 = vandps_avx(ZEXT1632(auVar123),auVar113);
      auVar156 = vmaxps_avx(auVar118,auVar131);
      auVar118 = vandps_avx(ZEXT1632(auVar107),auVar113);
      auVar118 = vmaxps_avx(auVar156,auVar118);
      auVar187 = vcmpps_avx(auVar118,auVar132,1);
      auVar118 = vblendvps_avx(ZEXT1632(auVar83),local_380,auVar187);
      auVar156 = vblendvps_avx(ZEXT1632(auVar123),local_3a0,auVar187);
      auVar12 = vfmadd213ps_fma(auVar145,auVar146,ZEXT1632(auVar12));
      auVar15 = vfmadd213ps_fma(auVar94,auVar94,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar116,auVar116);
      auVar145 = vrsqrtps_avx(ZEXT1632(auVar15));
      fVar121 = auVar145._0_4_;
      fVar98 = auVar145._4_4_;
      fVar100 = auVar145._8_4_;
      fVar102 = auVar145._12_4_;
      fVar103 = auVar145._16_4_;
      fVar104 = auVar145._20_4_;
      fVar105 = auVar145._24_4_;
      auVar23._4_4_ = fVar98 * fVar98 * fVar98 * auVar15._4_4_ * -0.5;
      auVar23._0_4_ = fVar121 * fVar121 * fVar121 * auVar15._0_4_ * -0.5;
      auVar23._8_4_ = fVar100 * fVar100 * fVar100 * auVar15._8_4_ * -0.5;
      auVar23._12_4_ = fVar102 * fVar102 * fVar102 * auVar15._12_4_ * -0.5;
      auVar23._16_4_ = fVar103 * fVar103 * fVar103 * -0.0;
      auVar23._20_4_ = fVar104 * fVar104 * fVar104 * -0.0;
      auVar23._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
      auVar23._28_4_ = auVar131._28_4_;
      auVar173._8_4_ = 0x3fc00000;
      auVar173._0_8_ = 0x3fc000003fc00000;
      auVar173._12_4_ = 0x3fc00000;
      auVar173._16_4_ = 0x3fc00000;
      auVar173._20_4_ = 0x3fc00000;
      auVar173._24_4_ = 0x3fc00000;
      auVar173._28_4_ = 0x3fc00000;
      auVar15 = vfmadd231ps_fma(auVar23,auVar173,auVar145);
      fVar121 = auVar15._0_4_;
      fVar98 = auVar15._4_4_;
      auVar24._4_4_ = fVar98 * auVar116._4_4_;
      auVar24._0_4_ = fVar121 * auVar116._0_4_;
      fVar100 = auVar15._8_4_;
      auVar24._8_4_ = fVar100 * auVar116._8_4_;
      fVar102 = auVar15._12_4_;
      auVar24._12_4_ = fVar102 * auVar116._12_4_;
      auVar24._16_4_ = auVar116._16_4_ * 0.0;
      auVar24._20_4_ = auVar116._20_4_ * 0.0;
      auVar24._24_4_ = auVar116._24_4_ * 0.0;
      auVar24._28_4_ = 0;
      auVar25._4_4_ = fVar98 * -auVar94._4_4_;
      auVar25._0_4_ = fVar121 * -auVar94._0_4_;
      auVar25._8_4_ = fVar100 * -auVar94._8_4_;
      auVar25._12_4_ = fVar102 * -auVar94._12_4_;
      auVar25._16_4_ = -auVar94._16_4_ * 0.0;
      auVar25._20_4_ = -auVar94._20_4_ * 0.0;
      auVar25._24_4_ = -auVar94._24_4_ * 0.0;
      auVar25._28_4_ = auVar145._28_4_;
      auVar15 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar156,auVar156);
      auVar131 = vrsqrtps_avx(ZEXT1632(auVar15));
      auVar26._28_4_ = auVar187._28_4_;
      auVar26._0_28_ =
           ZEXT1628(CONCAT412(fVar102 * 0.0,
                              CONCAT48(fVar100 * 0.0,CONCAT44(fVar98 * 0.0,fVar121 * 0.0))));
      fVar121 = auVar131._0_4_;
      fVar98 = auVar131._4_4_;
      fVar100 = auVar131._8_4_;
      fVar102 = auVar131._12_4_;
      fVar103 = auVar131._16_4_;
      fVar104 = auVar131._20_4_;
      fVar105 = auVar131._24_4_;
      auVar27._4_4_ = fVar98 * fVar98 * fVar98 * auVar15._4_4_ * -0.5;
      auVar27._0_4_ = fVar121 * fVar121 * fVar121 * auVar15._0_4_ * -0.5;
      auVar27._8_4_ = fVar100 * fVar100 * fVar100 * auVar15._8_4_ * -0.5;
      auVar27._12_4_ = fVar102 * fVar102 * fVar102 * auVar15._12_4_ * -0.5;
      auVar27._16_4_ = fVar103 * fVar103 * fVar103 * -0.0;
      auVar27._20_4_ = fVar104 * fVar104 * fVar104 * -0.0;
      auVar27._24_4_ = fVar105 * fVar105 * fVar105 * -0.0;
      auVar27._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar27,auVar173,auVar131);
      fVar121 = auVar15._0_4_;
      auVar192._0_4_ = auVar156._0_4_ * fVar121;
      fVar98 = auVar15._4_4_;
      auVar192._4_4_ = auVar156._4_4_ * fVar98;
      fVar100 = auVar15._8_4_;
      auVar192._8_4_ = auVar156._8_4_ * fVar100;
      fVar102 = auVar15._12_4_;
      auVar192._12_4_ = auVar156._12_4_ * fVar102;
      auVar192._16_4_ = auVar156._16_4_ * 0.0;
      auVar192._20_4_ = auVar156._20_4_ * 0.0;
      auVar192._24_4_ = auVar156._24_4_ * 0.0;
      auVar192._28_4_ = 0;
      auVar28._4_4_ = -auVar118._4_4_ * fVar98;
      auVar28._0_4_ = -auVar118._0_4_ * fVar121;
      auVar28._8_4_ = -auVar118._8_4_ * fVar100;
      auVar28._12_4_ = -auVar118._12_4_ * fVar102;
      auVar28._16_4_ = -auVar118._16_4_ * 0.0;
      auVar28._20_4_ = -auVar118._20_4_ * 0.0;
      auVar28._24_4_ = -auVar118._24_4_ * 0.0;
      auVar28._28_4_ = auVar156._28_4_;
      auVar118._28_4_ = auVar131._28_4_;
      auVar118._0_28_ =
           ZEXT1628(CONCAT412(fVar102 * 0.0,
                              CONCAT48(fVar100 * 0.0,CONCAT44(fVar98 * 0.0,fVar121 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar13),_local_340);
      auVar131 = ZEXT1632(auVar13);
      auVar16 = vfmadd213ps_fma(auVar25,auVar131,local_360);
      auVar84 = vfmadd213ps_fma(auVar26,auVar131,ZEXT1632(auVar12));
      auVar107 = vfnmadd213ps_fma(auVar24,auVar131,_local_340);
      auVar83 = vfmadd213ps_fma(auVar192,ZEXT1632(auVar14),auVar87);
      auVar82 = vfnmadd213ps_fma(auVar25,auVar131,local_360);
      auVar131 = ZEXT1632(auVar14);
      auVar123 = vfmadd213ps_fma(auVar28,auVar131,_local_320);
      auVar199 = ZEXT1632(auVar13);
      auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar12),auVar199,auVar26);
      auVar12 = vfmadd213ps_fma(auVar118,auVar131,ZEXT1632(auVar11));
      auVar108 = vfnmadd213ps_fma(auVar192,auVar131,auVar87);
      auVar136 = vfnmadd213ps_fma(auVar28,auVar131,_local_320);
      auVar81 = vfnmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar14),auVar118);
      auVar118 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar82));
      auVar131 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar142));
      auVar87._4_4_ = auVar142._4_4_ * auVar118._4_4_;
      auVar87._0_4_ = auVar142._0_4_ * auVar118._0_4_;
      auVar87._8_4_ = auVar142._8_4_ * auVar118._8_4_;
      auVar87._12_4_ = auVar142._12_4_ * auVar118._12_4_;
      auVar87._16_4_ = auVar118._16_4_ * 0.0;
      auVar87._20_4_ = auVar118._20_4_ * 0.0;
      auVar87._24_4_ = auVar118._24_4_ * 0.0;
      auVar87._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar87,ZEXT1632(auVar82),auVar131);
      auVar29._4_4_ = auVar131._4_4_ * auVar107._4_4_;
      auVar29._0_4_ = auVar131._0_4_ * auVar107._0_4_;
      auVar29._8_4_ = auVar131._8_4_ * auVar107._8_4_;
      auVar29._12_4_ = auVar131._12_4_ * auVar107._12_4_;
      auVar29._16_4_ = auVar131._16_4_ * 0.0;
      auVar29._20_4_ = auVar131._20_4_ * 0.0;
      auVar29._24_4_ = auVar131._24_4_ * 0.0;
      auVar29._28_4_ = auVar131._28_4_;
      auVar131 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar107));
      auVar11 = vfmsub231ps_fma(auVar29,ZEXT1632(auVar142),auVar131);
      auVar30._4_4_ = auVar82._4_4_ * auVar131._4_4_;
      auVar30._0_4_ = auVar82._0_4_ * auVar131._0_4_;
      auVar30._8_4_ = auVar82._8_4_ * auVar131._8_4_;
      auVar30._12_4_ = auVar82._12_4_ * auVar131._12_4_;
      auVar30._16_4_ = auVar131._16_4_ * 0.0;
      auVar30._20_4_ = auVar131._20_4_ * 0.0;
      auVar30._24_4_ = auVar131._24_4_ * 0.0;
      auVar30._28_4_ = auVar131._28_4_;
      auVar156 = ZEXT1632(auVar107);
      auVar107 = vfmsub231ps_fma(auVar30,auVar156,auVar118);
      auVar118 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar118,ZEXT1632(auVar11));
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,ZEXT1632(auVar13));
      auVar96 = vcmpps_avx(ZEXT1632(auVar11),ZEXT1232(ZEXT812(0)) << 0x20,2);
      auVar118 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar15),auVar96);
      auVar131 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar16),auVar96);
      local_600 = vblendvps_avx(ZEXT1632(auVar81),ZEXT1632(auVar84),auVar96);
      auVar145 = vblendvps_avx(auVar156,ZEXT1632(auVar83),auVar96);
      auVar94 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar123),auVar96);
      auVar166 = ZEXT3264(auVar94);
      auVar116 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar12),auVar96);
      auVar156 = vblendvps_avx(ZEXT1632(auVar83),auVar156,auVar96);
      auVar187 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar82),auVar96);
      auVar11 = vpackssdw_avx(local_400._0_16_,local_400._16_16_);
      auVar88 = vblendvps_avx(ZEXT1632(auVar12),ZEXT1632(auVar142),auVar96);
      auVar183 = vsubps_avx(auVar156,auVar118);
      auVar200 = vsubps_avx(auVar187,auVar131);
      auVar18 = vsubps_avx(auVar88,local_600);
      auVar87 = vsubps_avx(auVar118,auVar145);
      auVar112 = vsubps_avx(auVar131,auVar94);
      auVar17 = vsubps_avx(local_600,auVar116);
      auVar31._4_4_ = auVar18._4_4_ * auVar118._4_4_;
      auVar31._0_4_ = auVar18._0_4_ * auVar118._0_4_;
      auVar31._8_4_ = auVar18._8_4_ * auVar118._8_4_;
      auVar31._12_4_ = auVar18._12_4_ * auVar118._12_4_;
      auVar31._16_4_ = auVar18._16_4_ * auVar118._16_4_;
      auVar31._20_4_ = auVar18._20_4_ * auVar118._20_4_;
      auVar31._24_4_ = auVar18._24_4_ * auVar118._24_4_;
      auVar31._28_4_ = auVar88._28_4_;
      auVar12 = vfmsub231ps_fma(auVar31,local_600,auVar183);
      auVar32._4_4_ = auVar183._4_4_ * auVar131._4_4_;
      auVar32._0_4_ = auVar183._0_4_ * auVar131._0_4_;
      auVar32._8_4_ = auVar183._8_4_ * auVar131._8_4_;
      auVar32._12_4_ = auVar183._12_4_ * auVar131._12_4_;
      auVar32._16_4_ = auVar183._16_4_ * auVar131._16_4_;
      auVar32._20_4_ = auVar183._20_4_ * auVar131._20_4_;
      auVar32._24_4_ = auVar183._24_4_ * auVar131._24_4_;
      auVar32._28_4_ = auVar156._28_4_;
      auVar13 = vfmsub231ps_fma(auVar32,auVar118,auVar200);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar91._0_4_ = auVar200._0_4_ * local_600._0_4_;
      auVar91._4_4_ = auVar200._4_4_ * local_600._4_4_;
      auVar91._8_4_ = auVar200._8_4_ * local_600._8_4_;
      auVar91._12_4_ = auVar200._12_4_ * local_600._12_4_;
      auVar91._16_4_ = auVar200._16_4_ * local_600._16_4_;
      auVar91._20_4_ = auVar200._20_4_ * local_600._20_4_;
      auVar91._24_4_ = auVar200._24_4_ * local_600._24_4_;
      auVar91._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar91,auVar131,auVar18);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
      auVar92._0_4_ = auVar17._0_4_ * auVar145._0_4_;
      auVar92._4_4_ = auVar17._4_4_ * auVar145._4_4_;
      auVar92._8_4_ = auVar17._8_4_ * auVar145._8_4_;
      auVar92._12_4_ = auVar17._12_4_ * auVar145._12_4_;
      auVar92._16_4_ = auVar17._16_4_ * auVar145._16_4_;
      auVar92._20_4_ = auVar17._20_4_ * auVar145._20_4_;
      auVar92._24_4_ = auVar17._24_4_ * auVar145._24_4_;
      auVar92._28_4_ = 0;
      auVar12 = vfmsub231ps_fma(auVar92,auVar87,auVar116);
      auVar33._4_4_ = auVar112._4_4_ * auVar116._4_4_;
      auVar33._0_4_ = auVar112._0_4_ * auVar116._0_4_;
      auVar33._8_4_ = auVar112._8_4_ * auVar116._8_4_;
      auVar33._12_4_ = auVar112._12_4_ * auVar116._12_4_;
      auVar33._16_4_ = auVar112._16_4_ * auVar116._16_4_;
      auVar33._20_4_ = auVar112._20_4_ * auVar116._20_4_;
      auVar33._24_4_ = auVar112._24_4_ * auVar116._24_4_;
      auVar33._28_4_ = auVar116._28_4_;
      auVar15 = vfmsub231ps_fma(auVar33,auVar94,auVar17);
      auVar34._4_4_ = auVar87._4_4_ * auVar94._4_4_;
      auVar34._0_4_ = auVar87._0_4_ * auVar94._0_4_;
      auVar34._8_4_ = auVar87._8_4_ * auVar94._8_4_;
      auVar34._12_4_ = auVar87._12_4_ * auVar94._12_4_;
      auVar34._16_4_ = auVar87._16_4_ * auVar94._16_4_;
      auVar34._20_4_ = auVar87._20_4_ * auVar94._20_4_;
      auVar34._24_4_ = auVar87._24_4_ * auVar94._24_4_;
      auVar34._28_4_ = auVar187._28_4_;
      auVar16 = vfmsub231ps_fma(auVar34,auVar112,auVar145);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar145 = vmaxps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
      auVar145 = vcmpps_avx(auVar145,ZEXT832(0) << 0x20,2);
      auVar12 = vpackssdw_avx(auVar145._0_16_,auVar145._16_16_);
      auVar11 = vpand_avx(auVar12,auVar11);
      auVar145 = vpmovsxwd_avx2(auVar11);
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0x7f,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0xbf,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar145[0x1f]) {
LAB_01151f21:
        auVar174 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
      }
      else {
        auVar35._4_4_ = auVar200._4_4_ * auVar17._4_4_;
        auVar35._0_4_ = auVar200._0_4_ * auVar17._0_4_;
        auVar35._8_4_ = auVar200._8_4_ * auVar17._8_4_;
        auVar35._12_4_ = auVar200._12_4_ * auVar17._12_4_;
        auVar35._16_4_ = auVar200._16_4_ * auVar17._16_4_;
        auVar35._20_4_ = auVar200._20_4_ * auVar17._20_4_;
        auVar35._24_4_ = auVar200._24_4_ * auVar17._24_4_;
        auVar35._28_4_ = auVar145._28_4_;
        auVar83 = vfmsub231ps_fma(auVar35,auVar112,auVar18);
        auVar114._0_4_ = auVar18._0_4_ * auVar87._0_4_;
        auVar114._4_4_ = auVar18._4_4_ * auVar87._4_4_;
        auVar114._8_4_ = auVar18._8_4_ * auVar87._8_4_;
        auVar114._12_4_ = auVar18._12_4_ * auVar87._12_4_;
        auVar114._16_4_ = auVar18._16_4_ * auVar87._16_4_;
        auVar114._20_4_ = auVar18._20_4_ * auVar87._20_4_;
        auVar114._24_4_ = auVar18._24_4_ * auVar87._24_4_;
        auVar114._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar114,auVar183,auVar17);
        auVar36._4_4_ = auVar183._4_4_ * auVar112._4_4_;
        auVar36._0_4_ = auVar183._0_4_ * auVar112._0_4_;
        auVar36._8_4_ = auVar183._8_4_ * auVar112._8_4_;
        auVar36._12_4_ = auVar183._12_4_ * auVar112._12_4_;
        auVar36._16_4_ = auVar183._16_4_ * auVar112._16_4_;
        auVar36._20_4_ = auVar183._20_4_ * auVar112._20_4_;
        auVar36._24_4_ = auVar183._24_4_ * auVar112._24_4_;
        auVar36._28_4_ = auVar94._28_4_;
        auVar123 = vfmsub231ps_fma(auVar36,auVar87,auVar200);
        auVar12 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar123));
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar83),_DAT_01f7b000);
        auVar145 = vrcpps_avx(ZEXT1632(auVar16));
        auVar193._8_4_ = 0x3f800000;
        auVar193._0_8_ = 0x3f8000003f800000;
        auVar193._12_4_ = 0x3f800000;
        auVar193._16_4_ = 0x3f800000;
        auVar193._20_4_ = 0x3f800000;
        auVar193._24_4_ = 0x3f800000;
        auVar193._28_4_ = 0x3f800000;
        auVar12 = vfnmadd213ps_fma(auVar145,ZEXT1632(auVar16),auVar193);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar145,auVar145);
        auVar162._0_4_ = auVar123._0_4_ * local_600._0_4_;
        auVar162._4_4_ = auVar123._4_4_ * local_600._4_4_;
        auVar162._8_4_ = auVar123._8_4_ * local_600._8_4_;
        auVar162._12_4_ = auVar123._12_4_ * local_600._12_4_;
        auVar162._16_4_ = local_600._16_4_ * 0.0;
        auVar162._20_4_ = local_600._20_4_ * 0.0;
        auVar162._24_4_ = local_600._24_4_ * 0.0;
        auVar162._28_4_ = 0;
        auVar84 = vfmadd231ps_fma(auVar162,auVar131,ZEXT1632(auVar84));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar83),auVar118);
        fVar121 = auVar12._0_4_;
        fVar98 = auVar12._4_4_;
        fVar100 = auVar12._8_4_;
        fVar102 = auVar12._12_4_;
        auVar145 = ZEXT1632(CONCAT412(fVar102 * auVar84._12_4_,
                                      CONCAT48(fVar100 * auVar84._8_4_,
                                               CONCAT44(fVar98 * auVar84._4_4_,
                                                        fVar121 * auVar84._0_4_))));
        auVar166 = ZEXT3264(auVar145);
        auVar93._4_4_ = uVar78;
        auVar93._0_4_ = uVar78;
        auVar93._8_4_ = uVar78;
        auVar93._12_4_ = uVar78;
        auVar93._16_4_ = uVar78;
        auVar93._20_4_ = uVar78;
        auVar93._24_4_ = uVar78;
        auVar93._28_4_ = uVar78;
        uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar115._4_4_ = uVar76;
        auVar115._0_4_ = uVar76;
        auVar115._8_4_ = uVar76;
        auVar115._12_4_ = uVar76;
        auVar115._16_4_ = uVar76;
        auVar115._20_4_ = uVar76;
        auVar115._24_4_ = uVar76;
        auVar115._28_4_ = uVar76;
        auVar118 = vcmpps_avx(auVar93,auVar145,2);
        auVar131 = vcmpps_avx(auVar145,auVar115,2);
        auVar118 = vandps_avx(auVar131,auVar118);
        auVar12 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar11 = vpand_avx(auVar11,auVar12);
        auVar118 = vpmovsxwd_avx2(auVar11);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0x7f,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0xbf,0) == '\0') &&
            (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar118[0x1f]) goto LAB_01151f21;
        auVar118 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
        auVar12 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
        auVar11 = vpand_avx(auVar11,auVar12);
        auVar118 = vpmovsxwd_avx2(auVar11);
        auVar174 = ZEXT3264(CONCAT824(uStack_4e8,
                                      CONCAT816(uStack_4f0,CONCAT88(uStack_4f8,local_500))));
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          auVar94 = ZEXT1632(CONCAT412(fVar102 * auVar13._12_4_,
                                       CONCAT48(fVar100 * auVar13._8_4_,
                                                CONCAT44(fVar98 * auVar13._4_4_,
                                                         fVar121 * auVar13._0_4_))));
          auVar116 = ZEXT1632(CONCAT412(fVar102 * auVar15._12_4_,
                                        CONCAT48(fVar100 * auVar15._8_4_,
                                                 CONCAT44(fVar98 * auVar15._4_4_,
                                                          fVar121 * auVar15._0_4_))));
          auVar147._8_4_ = 0x3f800000;
          auVar147._0_8_ = 0x3f8000003f800000;
          auVar147._12_4_ = 0x3f800000;
          auVar147._16_4_ = 0x3f800000;
          auVar147._20_4_ = 0x3f800000;
          auVar147._24_4_ = 0x3f800000;
          auVar147._28_4_ = 0x3f800000;
          auVar131 = vsubps_avx(auVar147,auVar94);
          _local_2a0 = vblendvps_avx(auVar131,auVar94,auVar96);
          auVar131 = vsubps_avx(auVar147,auVar116);
          local_420 = vblendvps_avx(auVar131,auVar116,auVar96);
          auVar174 = ZEXT3264(auVar118);
          local_2c0 = auVar145;
        }
      }
      auVar205 = ZEXT3264(local_760);
      auVar201 = ZEXT3264(local_6c0);
      auVar198 = ZEXT3264(_local_5a0);
      auVar194 = ZEXT3264(local_720);
      auVar120 = ZEXT3264(auVar146);
      auVar188 = ZEXT3264(local_780);
      auVar118 = auVar174._0_32_;
      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar118 >> 0x7f,0) == '\0') &&
            (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar118 >> 0xbf,0) == '\0') &&
          (auVar174 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar174[0x1f]) goto LAB_01150b64;
      auVar131 = vsubps_avx(ZEXT1632(auVar14),auVar199);
      auVar11 = vfmadd213ps_fma(auVar131,_local_2a0,auVar199);
      fVar121 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
      auVar37._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar121;
      auVar37._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar121;
      auVar37._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar121;
      auVar37._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar121;
      auVar37._16_4_ = fVar121 * 0.0;
      auVar37._20_4_ = fVar121 * 0.0;
      auVar37._24_4_ = fVar121 * 0.0;
      auVar37._28_4_ = 0;
      auVar166 = ZEXT3264(local_2c0);
      auVar131 = vcmpps_avx(local_2c0,auVar37,6);
      auVar145 = auVar118 & auVar131;
      auVar174 = ZEXT3264(CONCAT428(local_6a0,
                                    CONCAT424(local_6a0,
                                              CONCAT420(local_6a0,
                                                        CONCAT416(local_6a0,
                                                                  CONCAT412(local_6a0,
                                                                            CONCAT48(local_6a0,
                                                                                     CONCAT44(
                                                  local_6a0,local_6a0))))))));
      auVar177 = ZEXT3264(local_6e0);
      if ((((((((auVar145 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar145 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar145 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar145 >> 0x7f,0) == '\0') &&
            (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar145 >> 0xbf,0) == '\0') &&
          (auVar145 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar145[0x1f]) {
        p_Var77 = (RTCFilterFunctionN)0x0;
        auVar120 = ZEXT3264(local_700);
      }
      else {
        auVar117._8_4_ = 0xbf800000;
        auVar117._0_8_ = 0xbf800000bf800000;
        auVar117._12_4_ = 0xbf800000;
        auVar117._16_4_ = 0xbf800000;
        auVar117._20_4_ = 0xbf800000;
        auVar117._24_4_ = 0xbf800000;
        auVar117._28_4_ = 0xbf800000;
        auVar133._8_4_ = 0x40000000;
        auVar133._0_8_ = 0x4000000040000000;
        auVar133._12_4_ = 0x40000000;
        auVar133._16_4_ = 0x40000000;
        auVar133._20_4_ = 0x40000000;
        auVar133._24_4_ = 0x40000000;
        auVar133._28_4_ = 0x40000000;
        auVar11 = vfmadd213ps_fma(local_420,auVar133,auVar117);
        local_240 = _local_2a0;
        local_220 = ZEXT1632(auVar11);
        local_200 = local_2c0;
        local_1e0 = 0;
        local_1d0 = local_5b0._0_8_;
        uStack_1c8 = local_5b0._8_8_;
        local_1c0 = local_650._0_8_;
        uStack_1b8 = local_650._8_8_;
        local_1b0 = local_660._0_8_;
        uStack_1a8 = local_660._8_8_;
        local_420 = local_220;
        if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          p_Var77 = (RTCFilterFunctionN)0x0;
        }
        else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                (p_Var77 = (RTCFilterFunctionN)CONCAT71((int7)((ulong)p_Var77 >> 8),1),
                pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar118 = vandps_avx(auVar131,auVar118);
          fVar121 = 1.0 / auVar89._0_4_;
          local_160[0] = fVar121 * ((float)local_2a0._0_4_ + 0.0);
          local_160[1] = fVar121 * ((float)local_2a0._4_4_ + 1.0);
          local_160[2] = fVar121 * (fStack_298 + 2.0);
          local_160[3] = fVar121 * (fStack_294 + 3.0);
          fStack_150 = fVar121 * (fStack_290 + 4.0);
          fStack_14c = fVar121 * (fStack_28c + 5.0);
          fStack_148 = fVar121 * (fStack_288 + 6.0);
          fStack_144 = fStack_284 + 7.0;
          local_420._0_8_ = auVar11._0_8_;
          local_420._8_8_ = auVar11._8_8_;
          local_140 = local_420._0_8_;
          uStack_138 = local_420._8_8_;
          uStack_130 = 0;
          uStack_128 = 0;
          local_120 = local_2c0;
          uVar76 = vmovmskps_avx(auVar118);
          uVar70 = 0;
          uVar72 = CONCAT44((int)((ulong)p_Var77 >> 0x20),uVar76);
          for (uVar19 = uVar72; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
            uVar70 = uVar70 + 1;
          }
          local_560._0_16_ = CONCAT412(uVar73,CONCAT48(uVar73,CONCAT44(uVar73,uVar73)));
          local_560 = ZEXT1632(local_560._0_16_);
          local_580._0_8_ = CONCAT44(uVar8,uVar8);
          local_580 = ZEXT1632(CONCAT412(uVar8,CONCAT48(uVar8,local_580._0_8_)));
          local_740 = auVar146;
          _local_3c0 = *pauVar1;
          local_1dc = iVar9;
          while (auVar146 = auVar120._0_32_, uVar72 != 0) {
            uVar76 = *(undefined4 *)(ray + k * 4 + 0x80);
            local_4a0 = local_160[uVar70];
            local_490 = *(undefined4 *)((long)&local_140 + uVar70 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_120 + uVar70 * 4);
            fVar101 = 1.0 - local_4a0;
            auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * fVar101)),
                                      ZEXT416((uint)(local_4a0 * fVar101)),ZEXT416(0xc0000000));
            auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_4a0 * fVar101)),
                                      ZEXT416((uint)(local_4a0 * local_4a0)),ZEXT416(0x40000000));
            auVar166 = ZEXT464(0x40400000);
            fVar97 = auVar11._0_4_ * 3.0;
            fVar99 = local_4a0 * local_4a0 * 3.0;
            auVar153._0_4_ = fVar99 * (float)local_4e0._0_4_;
            auVar153._4_4_ = fVar99 * (float)local_4e0._4_4_;
            auVar153._8_4_ = fVar99 * fStack_4d8;
            auVar153._12_4_ = fVar99 * fStack_4d4;
            auVar125._4_4_ = fVar97;
            auVar125._0_4_ = fVar97;
            auVar125._8_4_ = fVar97;
            auVar125._12_4_ = fVar97;
            auVar11 = vfmadd132ps_fma(auVar125,auVar153,local_660);
            fVar97 = auVar12._0_4_ * 3.0;
            auVar143._4_4_ = fVar97;
            auVar143._0_4_ = fVar97;
            auVar143._8_4_ = fVar97;
            auVar143._12_4_ = fVar97;
            auVar11 = vfmadd132ps_fma(auVar143,auVar11,local_650);
            fVar97 = fVar101 * fVar101 * -3.0;
            local_630.context = context->user;
            auVar126._4_4_ = fVar97;
            auVar126._0_4_ = fVar97;
            auVar126._8_4_ = fVar97;
            auVar126._12_4_ = fVar97;
            auVar11 = vfmadd132ps_fma(auVar126,auVar11,local_5b0);
            local_4d0 = auVar11._0_4_;
            local_4c0 = vshufps_avx(auVar11,auVar11,0x55);
            local_4b0 = vshufps_avx(auVar11,auVar11,0xaa);
            local_480 = local_580._0_8_;
            uStack_478 = local_580._8_8_;
            local_470 = local_560._0_16_;
            vpcmpeqd_avx2(ZEXT1632(local_560._0_16_),ZEXT1632(local_560._0_16_));
            uStack_45c = (local_630.context)->instID[0];
            local_460 = uStack_45c;
            uStack_458 = uStack_45c;
            uStack_454 = uStack_45c;
            uStack_450 = (local_630.context)->instPrimID[0];
            uStack_44c = uStack_450;
            uStack_448 = uStack_450;
            uStack_444 = uStack_450;
            local_7a0 = *local_640;
            local_630.valid = (int *)local_7a0;
            local_630.geometryUserPtr = pGVar10->userPtr;
            local_630.hit = (RTCHitN *)&local_4d0;
            local_630.N = 4;
            local_600._0_8_ = uVar72;
            local_630.ray = (RTCRayN *)ray;
            uStack_4cc = local_4d0;
            uStack_4c8 = local_4d0;
            uStack_4c4 = local_4d0;
            fStack_49c = local_4a0;
            fStack_498 = local_4a0;
            fStack_494 = local_4a0;
            uStack_48c = local_490;
            uStack_488 = local_490;
            uStack_484 = local_490;
            if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar166 = ZEXT1664(auVar166._0_16_);
              (*pGVar10->occlusionFilterN)(&local_630);
              auVar198 = ZEXT3264(_local_5a0);
              auVar120 = ZEXT3264(local_740);
              auVar177 = ZEXT3264(local_6e0);
              auVar174 = ZEXT3264(CONCAT428(fStack_684,
                                            CONCAT424(fStack_688,
                                                      CONCAT420(fStack_68c,
                                                                CONCAT416(fStack_690,
                                                                          CONCAT412(fStack_694,
                                                                                    CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
              auVar205 = ZEXT3264(local_760);
              auVar201 = ZEXT3264(local_6c0);
              auVar188 = ZEXT3264(local_780);
              auVar194 = ZEXT3264(local_720);
              uVar72 = local_600._0_8_;
            }
            if (local_7a0 == (undefined1  [16])0x0) {
              auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar11 = auVar11 ^ _DAT_01f46b70;
              fVar211 = (float)local_680;
              fVar212 = local_680._4_4_;
              fVar97 = (float)uStack_678;
              fVar99 = uStack_678._4_4_;
              fVar101 = (float)uStack_670;
              fVar189 = uStack_670._4_4_;
              fVar190 = (float)uStack_668;
            }
            else {
              p_Var77 = context->args->filter;
              if ((p_Var77 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar10->field_8).field_0x2 & 0x40) != 0))))
              {
                auVar166 = ZEXT1664(auVar166._0_16_);
                (*p_Var77)(&local_630);
                auVar198 = ZEXT3264(_local_5a0);
                auVar120 = ZEXT3264(local_740);
                auVar177 = ZEXT3264(local_6e0);
                auVar174 = ZEXT3264(CONCAT428(fStack_684,
                                              CONCAT424(fStack_688,
                                                        CONCAT420(fStack_68c,
                                                                  CONCAT416(fStack_690,
                                                                            CONCAT412(fStack_694,
                                                                                      CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                auVar205 = ZEXT3264(local_760);
                auVar201 = ZEXT3264(local_6c0);
                auVar188 = ZEXT3264(local_780);
                auVar194 = ZEXT3264(local_720);
                uVar72 = local_600._0_8_;
              }
              auVar12 = vpcmpeqd_avx(local_7a0,_DAT_01f45a50);
              auVar11 = auVar12 ^ _DAT_01f46b70;
              auVar127._8_4_ = 0xff800000;
              auVar127._0_8_ = 0xff800000ff800000;
              auVar127._12_4_ = 0xff800000;
              auVar12 = vblendvps_avx(auVar127,*(undefined1 (*) [16])(local_630.ray + 0x80),auVar12)
              ;
              *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar12;
              fVar211 = (float)local_680;
              fVar212 = local_680._4_4_;
              fVar97 = (float)uStack_678;
              fVar99 = uStack_678._4_4_;
              fVar101 = (float)uStack_670;
              fVar189 = uStack_670._4_4_;
              fVar190 = (float)uStack_668;
            }
            auVar146 = auVar120._0_32_;
            auVar110._8_8_ = 0x100000001;
            auVar110._0_8_ = 0x100000001;
            if ((auVar110 & auVar11) != (undefined1  [16])0x0) {
              p_Var77 = (RTCFilterFunctionN)CONCAT71((int7)(uVar72 >> 8),1);
              goto LAB_0115114f;
            }
            *(undefined4 *)(ray + k * 4 + 0x80) = uVar76;
            uVar19 = uVar70 & 0x3f;
            uVar70 = 0;
            uVar72 = uVar72 ^ 1L << uVar19;
            for (uVar19 = uVar72; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              uVar70 = uVar70 + 1;
            }
          }
          p_Var77 = (RTCFilterFunctionN)0x0;
        }
LAB_0115114f:
        auVar120 = ZEXT3264(local_700);
      }
    }
    auVar135 = ZEXT464((uint)fVar122);
    if (8 < iVar9) {
      local_3a0._4_4_ = iVar9;
      local_3a0._0_4_ = iVar9;
      local_3a0._8_4_ = iVar9;
      local_3a0._12_4_ = iVar9;
      local_3a0._16_4_ = iVar9;
      local_3a0._20_4_ = iVar9;
      local_3a0._24_4_ = iVar9;
      local_3a0._28_4_ = iVar9;
      local_400._4_4_ = fVar122;
      local_400._0_4_ = fVar122;
      fStack_3f8 = fVar122;
      fStack_3f4 = fVar122;
      fStack_3f0 = fVar122;
      fStack_3ec = fVar122;
      fStack_3e8 = fVar122;
      fStack_3e4 = fVar122;
      local_e0 = uVar78;
      uStack_dc = uVar78;
      uStack_d8 = uVar78;
      uStack_d4 = uVar78;
      uStack_d0 = uVar78;
      uStack_cc = uVar78;
      uStack_c8 = uVar78;
      uStack_c4 = uVar78;
      local_100 = 1.0 / (float)local_5c0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      local_5c0._4_4_ = (undefined4)local_788;
      local_5c0._0_4_ = (undefined4)local_788;
      uStack_5b8 = (undefined4)local_788;
      uStack_5b4 = (undefined4)local_788;
      local_2f0 = local_5e0._0_4_;
      uStack_2ec = local_5e0._0_4_;
      uStack_2e8 = local_5e0._0_4_;
      uStack_2e4 = local_5e0._0_4_;
      _local_5a0 = auVar198._0_32_;
      local_740 = auVar146;
      for (lVar74 = 8; lVar74 < iVar9; lVar74 = lVar74 + 8) {
        auVar183 = auVar188._0_32_;
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar74 * 4 + lVar79);
        auVar131 = *(undefined1 (*) [32])(lVar79 + 0x21fb768 + lVar74 * 4);
        local_5e0 = *(undefined1 (*) [32])(lVar79 + 0x21fbbec + lVar74 * 4);
        pauVar1 = (undefined1 (*) [32])(lVar79 + 0x21fc070 + lVar74 * 4);
        fVar98 = *(float *)*pauVar1;
        fVar100 = *(float *)(*pauVar1 + 4);
        fVar102 = *(float *)(*pauVar1 + 8);
        fVar103 = *(float *)(*pauVar1 + 0xc);
        fVar104 = *(float *)(*pauVar1 + 0x10);
        fVar105 = *(float *)(*pauVar1 + 0x14);
        fVar64 = *(float *)(*pauVar1 + 0x18);
        auVar67 = *(undefined1 (*) [28])*pauVar1;
        auVar197._0_4_ = fVar98 * auVar174._0_4_;
        auVar197._4_4_ = fVar100 * auVar174._4_4_;
        auVar197._8_4_ = fVar102 * auVar174._8_4_;
        auVar197._12_4_ = fVar103 * auVar174._12_4_;
        auVar197._16_4_ = fVar104 * auVar174._16_4_;
        auVar197._20_4_ = fVar105 * auVar174._20_4_;
        auVar197._28_36_ = auVar198._28_36_;
        auVar197._24_4_ = fVar64 * auVar174._24_4_;
        auVar198._0_4_ = fVar98 * fVar211;
        auVar198._4_4_ = fVar100 * fVar212;
        auVar198._8_4_ = fVar102 * fVar97;
        auVar198._12_4_ = fVar103 * fVar99;
        auVar198._16_4_ = fVar104 * fVar101;
        auVar198._20_4_ = fVar105 * fVar189;
        auVar198._28_36_ = auVar135._28_36_;
        auVar198._24_4_ = fVar64 * fVar190;
        auVar11 = vfmadd231ps_fma(auVar197._0_32_,local_5e0,auVar205._0_32_);
        auVar200 = auVar201._0_32_;
        auVar12 = vfmadd231ps_fma(auVar198._0_32_,local_5e0,auVar200);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar131,auVar172);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar131,auVar120._0_32_);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,auVar177._0_32_);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_540);
        auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar74 * 4 + lVar79);
        pauVar2 = (undefined1 (*) [32])(lVar79 + 0x21fdb88 + lVar74 * 4);
        auVar96 = *pauVar2;
        auVar145 = *(undefined1 (*) [32])(lVar79 + 0x21fe00c + lVar74 * 4);
        pauVar3 = (undefined1 (*) [32])(lVar79 + 0x21fe490 + lVar74 * 4);
        fVar65 = *(float *)*pauVar3;
        fVar175 = *(float *)(*pauVar3 + 4);
        fVar178 = *(float *)(*pauVar3 + 8);
        fVar206 = *(float *)(*pauVar3 + 0xc);
        fVar207 = *(float *)(*pauVar3 + 0x10);
        fVar208 = *(float *)(*pauVar3 + 0x14);
        fVar209 = *(float *)(*pauVar3 + 0x18);
        auVar68 = *(undefined1 (*) [28])*pauVar3;
        auVar38._4_4_ = auVar174._4_4_ * fVar175;
        auVar38._0_4_ = auVar174._0_4_ * fVar65;
        auVar38._8_4_ = auVar174._8_4_ * fVar178;
        auVar38._12_4_ = auVar174._12_4_ * fVar206;
        auVar38._16_4_ = auVar174._16_4_ * fVar207;
        auVar38._20_4_ = auVar174._20_4_ * fVar208;
        auVar38._24_4_ = auVar174._24_4_ * fVar209;
        auVar38._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
        auVar174._0_4_ = fVar211 * fVar65;
        auVar174._4_4_ = fVar212 * fVar175;
        auVar174._8_4_ = fVar97 * fVar178;
        auVar174._12_4_ = fVar99 * fVar206;
        auVar174._16_4_ = fVar101 * fVar207;
        auVar174._20_4_ = fVar189 * fVar208;
        auVar174._28_36_ = auVar166._28_36_;
        auVar174._24_4_ = fVar190 * fVar209;
        auVar13 = vfmadd231ps_fma(auVar38,auVar145,auVar205._0_32_);
        auVar14 = vfmadd231ps_fma(auVar174._0_32_,auVar145,auVar200);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar96,auVar172);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar96,auVar120._0_32_);
        auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar88,auVar177._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar88,local_540);
        local_380 = ZEXT1632(auVar13);
        local_580 = ZEXT1632(auVar11);
        auVar116 = vsubps_avx(local_380,local_580);
        local_560 = ZEXT1632(auVar14);
        local_600 = ZEXT1632(auVar12);
        local_360 = vsubps_avx(local_560,local_600);
        auVar95._0_4_ = auVar12._0_4_ * auVar116._0_4_;
        auVar95._4_4_ = auVar12._4_4_ * auVar116._4_4_;
        auVar95._8_4_ = auVar12._8_4_ * auVar116._8_4_;
        auVar95._12_4_ = auVar12._12_4_ * auVar116._12_4_;
        auVar95._16_4_ = auVar116._16_4_ * 0.0;
        auVar95._20_4_ = auVar116._20_4_ * 0.0;
        auVar95._24_4_ = auVar116._24_4_ * 0.0;
        auVar95._28_4_ = 0;
        fVar122 = local_360._0_4_;
        auVar188._0_4_ = auVar11._0_4_ * fVar122;
        fVar97 = local_360._4_4_;
        auVar188._4_4_ = auVar11._4_4_ * fVar97;
        fVar99 = local_360._8_4_;
        auVar188._8_4_ = auVar11._8_4_ * fVar99;
        fVar101 = local_360._12_4_;
        auVar188._12_4_ = auVar11._12_4_ * fVar101;
        fVar189 = local_360._16_4_;
        auVar188._16_4_ = fVar189 * 0.0;
        fVar190 = local_360._20_4_;
        auVar188._20_4_ = fVar190 * 0.0;
        fVar121 = local_360._24_4_;
        auVar188._28_36_ = auVar120._28_36_;
        auVar188._24_4_ = fVar121 * 0.0;
        auVar198 = ZEXT3264(local_5e0);
        auVar156 = vsubps_avx(auVar95,auVar188._0_32_);
        auVar163._0_4_ = fVar98 * (float)local_280._0_4_;
        auVar163._4_4_ = fVar100 * (float)local_280._4_4_;
        auVar163._8_4_ = fVar102 * fStack_278;
        auVar163._12_4_ = fVar103 * fStack_274;
        auVar163._16_4_ = fVar104 * fStack_270;
        auVar163._20_4_ = fVar105 * fStack_26c;
        auVar163._24_4_ = fVar64 * fStack_268;
        auVar163._28_4_ = 0;
        auVar11 = vfmadd231ps_fma(auVar163,local_5e0,local_a0);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar131,local_80);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_260,auVar118);
        auVar166 = ZEXT1664(auVar11);
        auVar39._4_4_ = (float)local_280._4_4_ * fVar175;
        auVar39._0_4_ = (float)local_280._0_4_ * fVar65;
        auVar39._8_4_ = fStack_278 * fVar178;
        auVar39._12_4_ = fStack_274 * fVar206;
        auVar39._16_4_ = fStack_270 * fVar207;
        auVar39._20_4_ = fStack_26c * fVar208;
        auVar39._24_4_ = fStack_268 * fVar209;
        auVar39._28_4_ = uStack_264;
        auVar12 = vfmadd231ps_fma(auVar39,auVar145,local_a0);
        auVar135 = ZEXT3264(auVar96);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar96,local_80);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar88,local_260);
        auVar40._4_4_ = fVar97 * fVar97;
        auVar40._0_4_ = fVar122 * fVar122;
        auVar40._8_4_ = fVar99 * fVar99;
        auVar40._12_4_ = fVar101 * fVar101;
        auVar40._16_4_ = fVar189 * fVar189;
        auVar40._20_4_ = fVar190 * fVar190;
        auVar40._24_4_ = fVar121 * fVar121;
        auVar40._28_4_ = local_260._28_4_;
        auVar13 = vfmadd231ps_fma(auVar40,auVar116,auVar116);
        auVar94 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
        auVar184._0_4_ = auVar94._0_4_ * auVar94._0_4_ * auVar13._0_4_;
        auVar184._4_4_ = auVar94._4_4_ * auVar94._4_4_ * auVar13._4_4_;
        auVar184._8_4_ = auVar94._8_4_ * auVar94._8_4_ * auVar13._8_4_;
        auVar184._12_4_ = auVar94._12_4_ * auVar94._12_4_ * auVar13._12_4_;
        auVar184._16_4_ = auVar94._16_4_ * auVar94._16_4_ * 0.0;
        auVar184._20_4_ = auVar94._20_4_ * auVar94._20_4_ * 0.0;
        auVar184._24_4_ = auVar94._24_4_ * auVar94._24_4_ * 0.0;
        auVar184._28_4_ = 0;
        auVar41._4_4_ = auVar156._4_4_ * auVar156._4_4_;
        auVar41._0_4_ = auVar156._0_4_ * auVar156._0_4_;
        auVar41._8_4_ = auVar156._8_4_ * auVar156._8_4_;
        auVar41._12_4_ = auVar156._12_4_ * auVar156._12_4_;
        auVar41._16_4_ = auVar156._16_4_ * auVar156._16_4_;
        auVar41._20_4_ = auVar156._20_4_ * auVar156._20_4_;
        auVar41._24_4_ = auVar156._24_4_ * auVar156._24_4_;
        auVar41._28_4_ = auVar156._28_4_;
        auVar94 = vcmpps_avx(auVar41,auVar184,2);
        local_1e0 = (int)lVar74;
        auVar185._4_4_ = local_1e0;
        auVar185._0_4_ = local_1e0;
        auVar185._8_4_ = local_1e0;
        auVar185._12_4_ = local_1e0;
        auVar185._16_4_ = local_1e0;
        auVar185._20_4_ = local_1e0;
        auVar185._24_4_ = local_1e0;
        auVar185._28_4_ = local_1e0;
        auVar156 = vpor_avx2(auVar185,_DAT_01fb4ba0);
        auVar187 = vpcmpgtd_avx2(local_3a0,auVar156);
        auVar156 = auVar187 & auVar94;
        if ((((((((auVar156 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar156 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar156 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar156 >> 0x7f,0) == '\0') &&
              (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar156 >> 0xbf,0) == '\0') &&
            (auVar156 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar156[0x1f]) {
          auVar188 = ZEXT3264(auVar183);
          auVar201 = ZEXT3264(auVar200);
LAB_011519f5:
          auVar205 = ZEXT3264(local_760);
          auVar174 = ZEXT3264(CONCAT428(fStack_684,
                                        CONCAT424(fStack_688,
                                                  CONCAT420(fStack_68c,
                                                            CONCAT416(fStack_690,
                                                                      CONCAT412(fStack_694,
                                                                                CONCAT48(fStack_698,
                                                                                         CONCAT44(
                                                  fStack_69c,local_6a0))))))));
          auVar120 = ZEXT3264(local_700);
          auVar177 = ZEXT3264(local_6e0);
        }
        else {
          _local_3c0 = vandps_avx(auVar187,auVar94);
          local_340._0_4_ = auVar68._0_4_;
          local_340._4_4_ = auVar68._4_4_;
          fStack_338 = auVar68._8_4_;
          fStack_334 = auVar68._12_4_;
          fStack_330 = auVar68._16_4_;
          fStack_32c = auVar68._20_4_;
          fStack_328 = auVar68._24_4_;
          auVar42._4_4_ = (float)local_5a0._4_4_ * (float)local_340._4_4_;
          auVar42._0_4_ = (float)local_5a0._0_4_ * (float)local_340._0_4_;
          auVar42._8_4_ = fStack_598 * fStack_338;
          auVar42._12_4_ = fStack_594 * fStack_334;
          auVar42._16_4_ = fStack_590 * fStack_330;
          auVar42._20_4_ = fStack_58c * fStack_32c;
          auVar42._24_4_ = fStack_588 * fStack_328;
          auVar42._28_4_ = auVar94._28_4_;
          auVar13 = vfmadd213ps_fma(auVar145,local_c0,auVar42);
          auVar13 = vfmadd213ps_fma(auVar96,local_3e0,ZEXT1632(auVar13));
          auVar13 = vfmadd132ps_fma(auVar88,ZEXT1632(auVar13),local_740);
          local_320._0_4_ = auVar67._0_4_;
          local_320._4_4_ = auVar67._4_4_;
          fStack_318 = auVar67._8_4_;
          fStack_314 = auVar67._12_4_;
          fStack_310 = auVar67._16_4_;
          fStack_30c = auVar67._20_4_;
          fStack_308 = auVar67._24_4_;
          auVar137._0_4_ = (float)local_5a0._0_4_ * (float)local_320._0_4_;
          auVar137._4_4_ = (float)local_5a0._4_4_ * (float)local_320._4_4_;
          auVar137._8_4_ = fStack_598 * fStack_318;
          auVar137._12_4_ = fStack_594 * fStack_314;
          auVar137._16_4_ = fStack_590 * fStack_310;
          auVar137._20_4_ = fStack_58c * fStack_30c;
          auVar137._24_4_ = fStack_588 * fStack_308;
          auVar137._28_4_ = 0;
          auVar14 = vfmadd213ps_fma(local_5e0,local_c0,auVar137);
          auVar14 = vfmadd213ps_fma(auVar131,local_3e0,ZEXT1632(auVar14));
          auVar131 = *(undefined1 (*) [32])(lVar79 + 0x21fc4f4 + lVar74 * 4);
          auVar145 = *(undefined1 (*) [32])(lVar79 + 0x21fc978 + lVar74 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar79 + 0x21fcdfc + lVar74 * 4);
          pfVar4 = (float *)(lVar79 + 0x21fd280 + lVar74 * 4);
          fVar122 = *pfVar4;
          fVar97 = pfVar4[1];
          fVar99 = pfVar4[2];
          fVar101 = pfVar4[3];
          fVar189 = pfVar4[4];
          fVar190 = pfVar4[5];
          fVar121 = pfVar4[6];
          auVar166._0_4_ = local_6a0 * fVar122;
          auVar166._4_4_ = fStack_69c * fVar97;
          auVar166._8_4_ = fStack_698 * fVar99;
          auVar166._12_4_ = fStack_694 * fVar101;
          auVar166._16_4_ = fStack_690 * fVar189;
          auVar166._20_4_ = fStack_68c * fVar190;
          auVar166._28_36_ = auVar177._28_36_;
          auVar166._24_4_ = fStack_688 * fVar121;
          auVar195._0_4_ = fVar122 * (float)local_680;
          auVar195._4_4_ = fVar97 * local_680._4_4_;
          auVar195._8_4_ = fVar99 * (float)uStack_678;
          auVar195._12_4_ = fVar101 * uStack_678._4_4_;
          auVar195._16_4_ = fVar189 * (float)uStack_670;
          auVar195._20_4_ = fVar190 * uStack_670._4_4_;
          auVar195._24_4_ = fVar121 * (float)uStack_668;
          auVar195._28_4_ = 0;
          auVar43._4_4_ = fVar97 * (float)local_5a0._4_4_;
          auVar43._0_4_ = fVar122 * (float)local_5a0._0_4_;
          auVar43._8_4_ = fVar99 * fStack_598;
          auVar43._12_4_ = fVar101 * fStack_594;
          auVar43._16_4_ = fVar189 * fStack_590;
          auVar43._20_4_ = fVar190 * fStack_58c;
          auVar43._24_4_ = fVar121 * fStack_588;
          auVar43._28_4_ = pfVar4[7];
          auVar15 = vfmadd231ps_fma(auVar166._0_32_,auVar94,local_760);
          auVar16 = vfmadd231ps_fma(auVar195,auVar94,auVar200);
          auVar84 = vfmadd231ps_fma(auVar43,local_c0,auVar94);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar145,auVar172);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar145,local_700);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar145,local_3e0);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar131,local_6e0);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar131,local_540);
          auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar131,local_740);
          pfVar4 = (float *)(lVar79 + 0x21ff6a0 + lVar74 * 4);
          fVar122 = *pfVar4;
          fVar97 = pfVar4[1];
          fVar99 = pfVar4[2];
          fVar101 = pfVar4[3];
          fVar189 = pfVar4[4];
          fVar190 = pfVar4[5];
          fVar121 = pfVar4[6];
          auVar44._4_4_ = fStack_69c * fVar97;
          auVar44._0_4_ = local_6a0 * fVar122;
          auVar44._8_4_ = fStack_698 * fVar99;
          auVar44._12_4_ = fStack_694 * fVar101;
          auVar44._16_4_ = fStack_690 * fVar189;
          auVar44._20_4_ = fStack_68c * fVar190;
          auVar44._24_4_ = fStack_688 * fVar121;
          auVar44._28_4_ = fStack_684;
          auVar45._4_4_ = local_680._4_4_ * fVar97;
          auVar45._0_4_ = (float)local_680 * fVar122;
          auVar45._8_4_ = (float)uStack_678 * fVar99;
          auVar45._12_4_ = uStack_678._4_4_ * fVar101;
          auVar45._16_4_ = (float)uStack_670 * fVar189;
          auVar45._20_4_ = uStack_670._4_4_ * fVar190;
          auVar45._24_4_ = (float)uStack_668 * fVar121;
          auVar45._28_4_ = local_360._28_4_;
          auVar46._4_4_ = fVar97 * (float)local_5a0._4_4_;
          auVar46._0_4_ = fVar122 * (float)local_5a0._0_4_;
          auVar46._8_4_ = fVar99 * fStack_598;
          auVar46._12_4_ = fVar101 * fStack_594;
          auVar46._16_4_ = fVar189 * fStack_590;
          auVar46._20_4_ = fVar190 * fStack_58c;
          auVar46._24_4_ = fVar121 * fStack_588;
          auVar46._28_4_ = pfVar4[7];
          auVar131 = *(undefined1 (*) [32])(lVar79 + 0x21ff21c + lVar74 * 4);
          auVar83 = vfmadd231ps_fma(auVar44,auVar131,local_760);
          auVar123 = vfmadd231ps_fma(auVar45,auVar131,auVar200);
          auVar107 = vfmadd231ps_fma(auVar46,local_c0,auVar131);
          auVar131 = *(undefined1 (*) [32])(lVar79 + 0x21fed98 + lVar74 * 4);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar131,auVar172);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar131,local_700);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar131,local_3e0);
          auVar131 = *(undefined1 (*) [32])(lVar79 + 0x21fe914 + lVar74 * 4);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar131,local_6e0);
          auVar123 = vfmadd231ps_fma(ZEXT1632(auVar123),auVar131,local_540);
          auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),local_740,auVar131);
          auVar186._8_4_ = 0x7fffffff;
          auVar186._0_8_ = 0x7fffffff7fffffff;
          auVar186._12_4_ = 0x7fffffff;
          auVar186._16_4_ = 0x7fffffff;
          auVar186._20_4_ = 0x7fffffff;
          auVar186._24_4_ = 0x7fffffff;
          auVar186._28_4_ = 0x7fffffff;
          auVar131 = vandps_avx(ZEXT1632(auVar15),auVar186);
          auVar145 = vandps_avx(ZEXT1632(auVar16),auVar186);
          auVar145 = vmaxps_avx(auVar131,auVar145);
          auVar131 = vandps_avx(ZEXT1632(auVar84),auVar186);
          auVar131 = vmaxps_avx(auVar145,auVar131);
          auVar131 = vcmpps_avx(auVar131,_local_400,1);
          auVar94 = vblendvps_avx(ZEXT1632(auVar15),auVar116,auVar131);
          auVar156 = vblendvps_avx(ZEXT1632(auVar16),local_360,auVar131);
          auVar131 = vandps_avx(ZEXT1632(auVar83),auVar186);
          auVar145 = vandps_avx(ZEXT1632(auVar123),auVar186);
          auVar145 = vmaxps_avx(auVar131,auVar145);
          auVar131 = vandps_avx(auVar186,ZEXT1632(auVar107));
          auVar131 = vmaxps_avx(auVar145,auVar131);
          auVar145 = vcmpps_avx(auVar131,_local_400,1);
          auVar131 = vblendvps_avx(ZEXT1632(auVar83),auVar116,auVar145);
          auVar145 = vblendvps_avx(ZEXT1632(auVar123),local_360,auVar145);
          auVar14 = vfmadd213ps_fma(auVar118,local_740,ZEXT1632(auVar14));
          auVar15 = vfmadd213ps_fma(auVar94,auVar94,ZEXT832(0) << 0x20);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar156,auVar156);
          auVar118 = vrsqrtps_avx(ZEXT1632(auVar15));
          fVar122 = auVar118._0_4_;
          fVar97 = auVar118._4_4_;
          fVar99 = auVar118._8_4_;
          fVar101 = auVar118._12_4_;
          fVar189 = auVar118._16_4_;
          fVar190 = auVar118._20_4_;
          fVar121 = auVar118._24_4_;
          auVar47._4_4_ = fVar97 * fVar97 * fVar97 * auVar15._4_4_ * -0.5;
          auVar47._0_4_ = fVar122 * fVar122 * fVar122 * auVar15._0_4_ * -0.5;
          auVar47._8_4_ = fVar99 * fVar99 * fVar99 * auVar15._8_4_ * -0.5;
          auVar47._12_4_ = fVar101 * fVar101 * fVar101 * auVar15._12_4_ * -0.5;
          auVar47._16_4_ = fVar189 * fVar189 * fVar189 * -0.0;
          auVar47._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar47._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar47._28_4_ = 0;
          auVar204._8_4_ = 0x3fc00000;
          auVar204._0_8_ = 0x3fc000003fc00000;
          auVar204._12_4_ = 0x3fc00000;
          auVar204._16_4_ = 0x3fc00000;
          auVar204._20_4_ = 0x3fc00000;
          auVar204._24_4_ = 0x3fc00000;
          auVar204._28_4_ = 0x3fc00000;
          auVar15 = vfmadd231ps_fma(auVar47,auVar204,auVar118);
          fVar122 = auVar15._0_4_;
          fVar97 = auVar15._4_4_;
          auVar48._4_4_ = auVar156._4_4_ * fVar97;
          auVar48._0_4_ = auVar156._0_4_ * fVar122;
          fVar99 = auVar15._8_4_;
          auVar48._8_4_ = auVar156._8_4_ * fVar99;
          fVar101 = auVar15._12_4_;
          auVar48._12_4_ = auVar156._12_4_ * fVar101;
          auVar48._16_4_ = auVar156._16_4_ * 0.0;
          auVar48._20_4_ = auVar156._20_4_ * 0.0;
          auVar48._24_4_ = auVar156._24_4_ * 0.0;
          auVar48._28_4_ = auVar118._28_4_;
          auVar49._4_4_ = fVar97 * -auVar94._4_4_;
          auVar49._0_4_ = fVar122 * -auVar94._0_4_;
          auVar49._8_4_ = fVar99 * -auVar94._8_4_;
          auVar49._12_4_ = fVar101 * -auVar94._12_4_;
          auVar49._16_4_ = -auVar94._16_4_ * 0.0;
          auVar49._20_4_ = -auVar94._20_4_ * 0.0;
          auVar49._24_4_ = -auVar94._24_4_ * 0.0;
          auVar49._28_4_ = auVar156._28_4_;
          auVar15 = vfmadd213ps_fma(auVar131,auVar131,ZEXT832(0) << 0x20);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar145,auVar145);
          auVar118 = vrsqrtps_avx(ZEXT1632(auVar15));
          auVar50._28_4_ = auVar201._28_4_;
          auVar50._0_28_ =
               ZEXT1628(CONCAT412(fVar101 * 0.0,
                                  CONCAT48(fVar99 * 0.0,CONCAT44(fVar97 * 0.0,fVar122 * 0.0))));
          fVar122 = auVar118._0_4_;
          fVar97 = auVar118._4_4_;
          fVar99 = auVar118._8_4_;
          fVar101 = auVar118._12_4_;
          fVar189 = auVar118._16_4_;
          fVar190 = auVar118._20_4_;
          fVar121 = auVar118._24_4_;
          auVar51._4_4_ = fVar97 * fVar97 * fVar97 * auVar15._4_4_ * -0.5;
          auVar51._0_4_ = fVar122 * fVar122 * fVar122 * auVar15._0_4_ * -0.5;
          auVar51._8_4_ = fVar99 * fVar99 * fVar99 * auVar15._8_4_ * -0.5;
          auVar51._12_4_ = fVar101 * fVar101 * fVar101 * auVar15._12_4_ * -0.5;
          auVar51._16_4_ = fVar189 * fVar189 * fVar189 * -0.0;
          auVar51._20_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar51._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
          auVar51._28_4_ = 0;
          auVar15 = vfmadd231ps_fma(auVar51,auVar204,auVar118);
          fVar122 = auVar15._0_4_;
          fVar97 = auVar15._4_4_;
          auVar52._4_4_ = auVar145._4_4_ * fVar97;
          auVar52._0_4_ = auVar145._0_4_ * fVar122;
          fVar99 = auVar15._8_4_;
          auVar52._8_4_ = auVar145._8_4_ * fVar99;
          fVar101 = auVar15._12_4_;
          auVar52._12_4_ = auVar145._12_4_ * fVar101;
          auVar52._16_4_ = auVar145._16_4_ * 0.0;
          auVar52._20_4_ = auVar145._20_4_ * 0.0;
          auVar52._24_4_ = auVar145._24_4_ * 0.0;
          auVar52._28_4_ = 0;
          auVar53._4_4_ = fVar97 * -auVar131._4_4_;
          auVar53._0_4_ = fVar122 * -auVar131._0_4_;
          auVar53._8_4_ = fVar99 * -auVar131._8_4_;
          auVar53._12_4_ = fVar101 * -auVar131._12_4_;
          auVar53._16_4_ = -auVar131._16_4_ * 0.0;
          auVar53._20_4_ = -auVar131._20_4_ * 0.0;
          auVar53._24_4_ = -auVar131._24_4_ * 0.0;
          auVar53._28_4_ = auVar118._28_4_;
          auVar54._28_4_ = 0xbf000000;
          auVar54._0_28_ =
               ZEXT1628(CONCAT412(fVar101 * 0.0,
                                  CONCAT48(fVar99 * 0.0,CONCAT44(fVar97 * 0.0,fVar122 * 0.0))));
          auVar15 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar11),local_580);
          auVar118 = ZEXT1632(auVar11);
          auVar16 = vfmadd213ps_fma(auVar49,auVar118,local_600);
          auVar84 = vfmadd213ps_fma(auVar50,auVar118,ZEXT1632(auVar14));
          auVar107 = vfnmadd213ps_fma(auVar48,auVar118,local_580);
          auVar83 = vfmadd213ps_fma(auVar52,ZEXT1632(auVar12),local_380);
          auVar82 = vfnmadd213ps_fma(auVar49,auVar118,local_600);
          auVar118 = ZEXT1632(auVar12);
          auVar123 = vfmadd213ps_fma(auVar53,auVar118,local_560);
          auVar146 = ZEXT1632(auVar11);
          auVar11 = vfnmadd231ps_fma(ZEXT1632(auVar14),auVar146,auVar50);
          auVar14 = vfmadd213ps_fma(auVar54,auVar118,ZEXT1632(auVar13));
          auVar108 = vfnmadd213ps_fma(auVar52,auVar118,local_380);
          auVar136 = vfnmadd213ps_fma(auVar53,auVar118,local_560);
          auVar142 = vfnmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar12),auVar54);
          auVar118 = vsubps_avx(ZEXT1632(auVar123),ZEXT1632(auVar82));
          auVar131 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar11));
          auVar164._0_4_ = auVar118._0_4_ * auVar11._0_4_;
          auVar164._4_4_ = auVar118._4_4_ * auVar11._4_4_;
          auVar164._8_4_ = auVar118._8_4_ * auVar11._8_4_;
          auVar164._12_4_ = auVar118._12_4_ * auVar11._12_4_;
          auVar164._16_4_ = auVar118._16_4_ * 0.0;
          auVar164._20_4_ = auVar118._20_4_ * 0.0;
          auVar164._24_4_ = auVar118._24_4_ * 0.0;
          auVar164._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar164,ZEXT1632(auVar82),auVar131);
          auVar55._4_4_ = auVar107._4_4_ * auVar131._4_4_;
          auVar55._0_4_ = auVar107._0_4_ * auVar131._0_4_;
          auVar55._8_4_ = auVar107._8_4_ * auVar131._8_4_;
          auVar55._12_4_ = auVar107._12_4_ * auVar131._12_4_;
          auVar55._16_4_ = auVar131._16_4_ * 0.0;
          auVar55._20_4_ = auVar131._20_4_ * 0.0;
          auVar55._24_4_ = auVar131._24_4_ * 0.0;
          auVar55._28_4_ = auVar131._28_4_;
          auVar187 = ZEXT1632(auVar107);
          auVar131 = vsubps_avx(ZEXT1632(auVar83),auVar187);
          auVar96 = ZEXT1632(auVar11);
          auVar11 = vfmsub231ps_fma(auVar55,auVar96,auVar131);
          auVar56._4_4_ = auVar82._4_4_ * auVar131._4_4_;
          auVar56._0_4_ = auVar82._0_4_ * auVar131._0_4_;
          auVar56._8_4_ = auVar82._8_4_ * auVar131._8_4_;
          auVar56._12_4_ = auVar82._12_4_ * auVar131._12_4_;
          auVar56._16_4_ = auVar131._16_4_ * 0.0;
          auVar56._20_4_ = auVar131._20_4_ * 0.0;
          auVar56._24_4_ = auVar131._24_4_ * 0.0;
          auVar56._28_4_ = auVar131._28_4_;
          auVar107 = vfmsub231ps_fma(auVar56,auVar187,auVar118);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar107),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar200 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,2);
          auVar118 = vblendvps_avx(ZEXT1632(auVar108),ZEXT1632(auVar15),auVar200);
          auVar131 = vblendvps_avx(ZEXT1632(auVar136),ZEXT1632(auVar16),auVar200);
          auVar145 = vblendvps_avx(ZEXT1632(auVar142),ZEXT1632(auVar84),auVar200);
          auVar94 = vblendvps_avx(auVar187,ZEXT1632(auVar83),auVar200);
          auVar116 = vblendvps_avx(ZEXT1632(auVar82),ZEXT1632(auVar123),auVar200);
          auVar156 = vblendvps_avx(auVar96,ZEXT1632(auVar14),auVar200);
          auVar187 = vblendvps_avx(ZEXT1632(auVar83),auVar187,auVar200);
          auVar88 = vblendvps_avx(ZEXT1632(auVar123),ZEXT1632(auVar82),auVar200);
          auVar11 = vpackssdw_avx(local_3c0._0_16_,local_3c0._16_16_);
          auVar96 = vblendvps_avx(ZEXT1632(auVar14),auVar96,auVar200);
          auVar187 = vsubps_avx(auVar187,auVar118);
          auVar88 = vsubps_avx(auVar88,auVar131);
          auVar18 = vsubps_avx(auVar96,auVar145);
          auVar198 = ZEXT3264(auVar18);
          auVar87 = vsubps_avx(auVar118,auVar94);
          auVar89 = vsubps_avx(auVar131,auVar116);
          auVar112 = vsubps_avx(auVar145,auVar156);
          auVar157._0_4_ = auVar18._0_4_ * auVar118._0_4_;
          auVar157._4_4_ = auVar18._4_4_ * auVar118._4_4_;
          auVar157._8_4_ = auVar18._8_4_ * auVar118._8_4_;
          auVar157._12_4_ = auVar18._12_4_ * auVar118._12_4_;
          auVar157._16_4_ = auVar18._16_4_ * auVar118._16_4_;
          auVar157._20_4_ = auVar18._20_4_ * auVar118._20_4_;
          auVar157._24_4_ = auVar18._24_4_ * auVar118._24_4_;
          auVar157._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar157,auVar145,auVar187);
          auVar57._4_4_ = auVar187._4_4_ * auVar131._4_4_;
          auVar57._0_4_ = auVar187._0_4_ * auVar131._0_4_;
          auVar57._8_4_ = auVar187._8_4_ * auVar131._8_4_;
          auVar57._12_4_ = auVar187._12_4_ * auVar131._12_4_;
          auVar57._16_4_ = auVar187._16_4_ * auVar131._16_4_;
          auVar57._20_4_ = auVar187._20_4_ * auVar131._20_4_;
          auVar57._24_4_ = auVar187._24_4_ * auVar131._24_4_;
          auVar57._28_4_ = auVar96._28_4_;
          auVar14 = vfmsub231ps_fma(auVar57,auVar118,auVar88);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar13),_DAT_01f7b000);
          auVar158._0_4_ = auVar88._0_4_ * auVar145._0_4_;
          auVar158._4_4_ = auVar88._4_4_ * auVar145._4_4_;
          auVar158._8_4_ = auVar88._8_4_ * auVar145._8_4_;
          auVar158._12_4_ = auVar88._12_4_ * auVar145._12_4_;
          auVar158._16_4_ = auVar88._16_4_ * auVar145._16_4_;
          auVar158._20_4_ = auVar88._20_4_ * auVar145._20_4_;
          auVar158._24_4_ = auVar88._24_4_ * auVar145._24_4_;
          auVar158._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar158,auVar131,auVar18);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar135 = ZEXT1664(auVar14);
          auVar159._0_4_ = auVar112._0_4_ * auVar94._0_4_;
          auVar159._4_4_ = auVar112._4_4_ * auVar94._4_4_;
          auVar159._8_4_ = auVar112._8_4_ * auVar94._8_4_;
          auVar159._12_4_ = auVar112._12_4_ * auVar94._12_4_;
          auVar159._16_4_ = auVar112._16_4_ * auVar94._16_4_;
          auVar159._20_4_ = auVar112._20_4_ * auVar94._20_4_;
          auVar159._24_4_ = auVar112._24_4_ * auVar94._24_4_;
          auVar159._28_4_ = 0;
          auVar13 = vfmsub231ps_fma(auVar159,auVar87,auVar156);
          auVar58._4_4_ = auVar89._4_4_ * auVar156._4_4_;
          auVar58._0_4_ = auVar89._0_4_ * auVar156._0_4_;
          auVar58._8_4_ = auVar89._8_4_ * auVar156._8_4_;
          auVar58._12_4_ = auVar89._12_4_ * auVar156._12_4_;
          auVar58._16_4_ = auVar89._16_4_ * auVar156._16_4_;
          auVar58._20_4_ = auVar89._20_4_ * auVar156._20_4_;
          auVar58._24_4_ = auVar89._24_4_ * auVar156._24_4_;
          auVar58._28_4_ = auVar156._28_4_;
          auVar15 = vfmsub231ps_fma(auVar58,auVar116,auVar112);
          auVar59._4_4_ = auVar87._4_4_ * auVar116._4_4_;
          auVar59._0_4_ = auVar87._0_4_ * auVar116._0_4_;
          auVar59._8_4_ = auVar87._8_4_ * auVar116._8_4_;
          auVar59._12_4_ = auVar87._12_4_ * auVar116._12_4_;
          auVar59._16_4_ = auVar87._16_4_ * auVar116._16_4_;
          auVar59._20_4_ = auVar87._20_4_ * auVar116._20_4_;
          auVar59._24_4_ = auVar87._24_4_ * auVar116._24_4_;
          auVar59._28_4_ = auVar116._28_4_;
          auVar16 = vfmsub231ps_fma(auVar59,auVar89,auVar94);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar13));
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar94 = vmaxps_avx(ZEXT1632(auVar14),ZEXT1632(auVar15));
          auVar94 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,2);
          auVar166 = ZEXT1664(auVar94._16_16_);
          auVar13 = vpackssdw_avx(auVar94._0_16_,auVar94._16_16_);
          auVar11 = vpand_avx(auVar13,auVar11);
          auVar94 = vpmovsxwd_avx2(auVar11);
          if ((((((((auVar94 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar94 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar94 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar94 >> 0x7f,0) == '\0') &&
                (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar94 >> 0xbf,0) == '\0') &&
              (auVar94 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar94[0x1f]) {
LAB_01151e6f:
            auVar140._8_8_ = uStack_4f8;
            auVar140._0_8_ = local_500;
            auVar140._16_8_ = uStack_4f0;
            auVar140._24_8_ = uStack_4e8;
            auVar194 = ZEXT3264(auVar194._0_32_);
            auVar188 = ZEXT3264(auVar183);
          }
          else {
            auVar60._4_4_ = auVar88._4_4_ * auVar112._4_4_;
            auVar60._0_4_ = auVar88._0_4_ * auVar112._0_4_;
            auVar60._8_4_ = auVar88._8_4_ * auVar112._8_4_;
            auVar60._12_4_ = auVar88._12_4_ * auVar112._12_4_;
            auVar60._16_4_ = auVar88._16_4_ * auVar112._16_4_;
            auVar60._20_4_ = auVar88._20_4_ * auVar112._20_4_;
            auVar60._24_4_ = auVar88._24_4_ * auVar112._24_4_;
            auVar60._28_4_ = auVar94._28_4_;
            auVar83 = vfmsub231ps_fma(auVar60,auVar89,auVar18);
            auVar165._0_4_ = auVar18._0_4_ * auVar87._0_4_;
            auVar165._4_4_ = auVar18._4_4_ * auVar87._4_4_;
            auVar165._8_4_ = auVar18._8_4_ * auVar87._8_4_;
            auVar165._12_4_ = auVar18._12_4_ * auVar87._12_4_;
            auVar165._16_4_ = auVar18._16_4_ * auVar87._16_4_;
            auVar165._20_4_ = auVar18._20_4_ * auVar87._20_4_;
            auVar165._24_4_ = auVar18._24_4_ * auVar87._24_4_;
            auVar165._28_4_ = 0;
            auVar84 = vfmsub231ps_fma(auVar165,auVar187,auVar112);
            auVar61._4_4_ = auVar187._4_4_ * auVar89._4_4_;
            auVar61._0_4_ = auVar187._0_4_ * auVar89._0_4_;
            auVar61._8_4_ = auVar187._8_4_ * auVar89._8_4_;
            auVar61._12_4_ = auVar187._12_4_ * auVar89._12_4_;
            auVar61._16_4_ = auVar187._16_4_ * auVar89._16_4_;
            auVar61._20_4_ = auVar187._20_4_ * auVar89._20_4_;
            auVar61._24_4_ = auVar187._24_4_ * auVar89._24_4_;
            auVar61._28_4_ = auVar89._28_4_;
            auVar123 = vfmsub231ps_fma(auVar61,auVar87,auVar88);
            auVar13 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar123));
            auVar16 = vfmadd231ps_fma(ZEXT1632(auVar13),ZEXT1632(auVar83),ZEXT832(0) << 0x20);
            auVar94 = vrcpps_avx(ZEXT1632(auVar16));
            auVar196._8_4_ = 0x3f800000;
            auVar196._0_8_ = 0x3f8000003f800000;
            auVar196._12_4_ = 0x3f800000;
            auVar196._16_4_ = 0x3f800000;
            auVar196._20_4_ = 0x3f800000;
            auVar196._24_4_ = 0x3f800000;
            auVar196._28_4_ = 0x3f800000;
            auVar198 = ZEXT3264(auVar196);
            auVar13 = vfnmadd213ps_fma(auVar94,ZEXT1632(auVar16),auVar196);
            auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar94,auVar94);
            auVar138._0_4_ = auVar123._0_4_ * auVar145._0_4_;
            auVar138._4_4_ = auVar123._4_4_ * auVar145._4_4_;
            auVar138._8_4_ = auVar123._8_4_ * auVar145._8_4_;
            auVar138._12_4_ = auVar123._12_4_ * auVar145._12_4_;
            auVar138._16_4_ = auVar145._16_4_ * 0.0;
            auVar138._20_4_ = auVar145._20_4_ * 0.0;
            auVar138._24_4_ = auVar145._24_4_ * 0.0;
            auVar138._28_4_ = 0;
            auVar84 = vfmadd231ps_fma(auVar138,ZEXT1632(auVar84),auVar131);
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar118,ZEXT1632(auVar83));
            fVar122 = auVar13._0_4_;
            fVar97 = auVar13._4_4_;
            fVar99 = auVar13._8_4_;
            fVar101 = auVar13._12_4_;
            auVar145 = ZEXT1632(CONCAT412(fVar101 * auVar84._12_4_,
                                          CONCAT48(fVar99 * auVar84._8_4_,
                                                   CONCAT44(fVar97 * auVar84._4_4_,
                                                            fVar122 * auVar84._0_4_))));
            uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar139._4_4_ = uVar78;
            auVar139._0_4_ = uVar78;
            auVar139._8_4_ = uVar78;
            auVar139._12_4_ = uVar78;
            auVar139._16_4_ = uVar78;
            auVar139._20_4_ = uVar78;
            auVar139._24_4_ = uVar78;
            auVar139._28_4_ = uVar78;
            auVar66._4_4_ = uStack_dc;
            auVar66._0_4_ = local_e0;
            auVar66._8_4_ = uStack_d8;
            auVar66._12_4_ = uStack_d4;
            auVar66._16_4_ = uStack_d0;
            auVar66._20_4_ = uStack_cc;
            auVar66._24_4_ = uStack_c8;
            auVar66._28_4_ = uStack_c4;
            auVar118 = vcmpps_avx(auVar66,auVar145,2);
            auVar131 = vcmpps_avx(auVar145,auVar139,2);
            auVar118 = vandps_avx(auVar131,auVar118);
            auVar13 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar11 = vpand_avx(auVar11,auVar13);
            auVar118 = vpmovsxwd_avx2(auVar11);
            auVar166 = ZEXT3264(auVar118);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0x7f,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0xbf,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar118[0x1f]) goto LAB_01151e6f;
            auVar118 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,4);
            auVar13 = vpackssdw_avx(auVar118._0_16_,auVar118._16_16_);
            auVar11 = vpand_avx(auVar11,auVar13);
            auVar118 = vpmovsxwd_avx2(auVar11);
            auVar166 = ZEXT3264(auVar118);
            auVar140._8_8_ = uStack_4f8;
            auVar140._0_8_ = local_500;
            auVar140._16_8_ = uStack_4f0;
            auVar140._24_8_ = uStack_4e8;
            auVar194 = ZEXT3264(auVar194._0_32_);
            auVar188 = ZEXT3264(auVar183);
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar118 >> 0x7f,0) != '\0') ||
                  (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0xbf,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar118[0x1f] < '\0') {
              auVar94 = ZEXT1632(CONCAT412(fVar101 * auVar14._12_4_,
                                           CONCAT48(fVar99 * auVar14._8_4_,
                                                    CONCAT44(fVar97 * auVar14._4_4_,
                                                             fVar122 * auVar14._0_4_))));
              auVar62._28_4_ = SUB84(uStack_4e8,4);
              auVar62._0_28_ =
                   ZEXT1628(CONCAT412(fVar101 * auVar15._12_4_,
                                      CONCAT48(fVar99 * auVar15._8_4_,
                                               CONCAT44(fVar97 * auVar15._4_4_,
                                                        fVar122 * auVar15._0_4_))));
              auVar176._8_4_ = 0x3f800000;
              auVar176._0_8_ = 0x3f8000003f800000;
              auVar176._12_4_ = 0x3f800000;
              auVar176._16_4_ = 0x3f800000;
              auVar176._20_4_ = 0x3f800000;
              auVar176._24_4_ = 0x3f800000;
              auVar176._28_4_ = 0x3f800000;
              auVar131 = vsubps_avx(auVar176,auVar94);
              auVar131 = vblendvps_avx(auVar131,auVar94,auVar200);
              auVar194 = ZEXT3264(auVar131);
              auVar131 = vsubps_avx(auVar176,auVar62);
              local_440 = vblendvps_avx(auVar131,auVar62,auVar200);
              auVar135 = ZEXT3264(local_440);
              auVar188 = ZEXT3264(auVar145);
              auVar140 = auVar118;
            }
          }
          auVar205 = ZEXT3264(local_760);
          auVar201 = ZEXT3264(local_6c0);
          if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar140 >> 0x7f,0) == '\0') &&
                (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar140 >> 0xbf,0) == '\0') &&
              (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar140[0x1f]) goto LAB_011519f5;
          auVar118 = vsubps_avx(ZEXT1632(auVar12),auVar146);
          local_720 = auVar194._0_32_;
          auVar11 = vfmadd213ps_fma(auVar118,local_720,auVar146);
          fVar122 = *(float *)((long)local_638->ray_space + k * 4 + -0x10);
          auVar63._4_4_ = (auVar11._4_4_ + auVar11._4_4_) * fVar122;
          auVar63._0_4_ = (auVar11._0_4_ + auVar11._0_4_) * fVar122;
          auVar63._8_4_ = (auVar11._8_4_ + auVar11._8_4_) * fVar122;
          auVar63._12_4_ = (auVar11._12_4_ + auVar11._12_4_) * fVar122;
          auVar63._16_4_ = fVar122 * 0.0;
          auVar63._20_4_ = fVar122 * 0.0;
          auVar63._24_4_ = fVar122 * 0.0;
          auVar63._28_4_ = fVar122;
          local_780 = auVar188._0_32_;
          auVar118 = vcmpps_avx(local_780,auVar63,6);
          auVar131 = auVar140 & auVar118;
          auVar174 = ZEXT3264(CONCAT428(fStack_684,
                                        CONCAT424(fStack_688,
                                                  CONCAT420(fStack_68c,
                                                            CONCAT416(fStack_690,
                                                                      CONCAT412(fStack_694,
                                                                                CONCAT48(fStack_698,
                                                                                         CONCAT44(
                                                  fStack_69c,local_6a0))))))));
          auVar177 = ZEXT3264(local_6e0);
          if ((((((((auVar131 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar131 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar131 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar131 >> 0x7f,0) == '\0') &&
                (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar131 >> 0xbf,0) == '\0') &&
              (auVar131 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar131[0x1f]) {
            auVar120 = ZEXT3264(local_700);
          }
          else {
            auVar119._8_4_ = 0xbf800000;
            auVar119._0_8_ = 0xbf800000bf800000;
            auVar119._12_4_ = 0xbf800000;
            auVar119._16_4_ = 0xbf800000;
            auVar119._20_4_ = 0xbf800000;
            auVar119._24_4_ = 0xbf800000;
            auVar119._28_4_ = 0xbf800000;
            auVar134._8_4_ = 0x40000000;
            auVar134._0_8_ = 0x4000000040000000;
            auVar134._12_4_ = 0x40000000;
            auVar134._16_4_ = 0x40000000;
            auVar134._20_4_ = 0x40000000;
            auVar134._24_4_ = 0x40000000;
            auVar134._28_4_ = 0x40000000;
            auVar135 = ZEXT3264(auVar134);
            auVar11 = vfmadd213ps_fma(local_440,auVar134,auVar119);
            local_220 = ZEXT1632(auVar11);
            local_1d0 = local_5b0._0_8_;
            uStack_1c8 = local_5b0._8_8_;
            local_1c0 = local_650._0_8_;
            uStack_1b8 = local_650._8_8_;
            local_1b0 = local_660._0_8_;
            uStack_1a8 = local_660._8_8_;
            pGVar10 = (context->scene->geometries).items[local_788].ptr;
            local_440 = local_220;
            if ((pGVar10->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              pRVar71 = (RTCIntersectArguments *)0x0;
              auVar120 = ZEXT3264(local_700);
            }
            else {
              pRVar71 = context->args;
              auVar120 = ZEXT3264(local_700);
              if ((pRVar71->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar71 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar71 >> 8),1),
                 pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_5e0._0_4_ = (int)p_Var77;
                auVar118 = vandps_avx(auVar118,auVar140);
                fVar122 = (float)local_1e0;
                auVar135 = ZEXT3264(CONCAT428(fVar122,CONCAT424(fVar122,CONCAT420(fVar122,CONCAT416(
                                                  fVar122,CONCAT412(fVar122,CONCAT48(fVar122,
                                                  CONCAT44(fVar122,fVar122))))))));
                local_160[0] = (fVar122 + auVar194._0_4_ + 0.0) * local_100;
                local_160[1] = (fVar122 + auVar194._4_4_ + 1.0) * fStack_fc;
                local_160[2] = (fVar122 + auVar194._8_4_ + 2.0) * fStack_f8;
                local_160[3] = (fVar122 + auVar194._12_4_ + 3.0) * fStack_f4;
                fStack_150 = (fVar122 + auVar194._16_4_ + 4.0) * fStack_f0;
                fStack_14c = (fVar122 + auVar194._20_4_ + 5.0) * fStack_ec;
                fStack_148 = (fVar122 + auVar194._24_4_ + 6.0) * fStack_e8;
                fStack_144 = fVar122 + auVar194._28_4_ + 7.0;
                local_440._0_8_ = auVar11._0_8_;
                local_440._8_8_ = auVar11._8_8_;
                local_140 = local_440._0_8_;
                uStack_138 = local_440._8_8_;
                uStack_130 = 0;
                uStack_128 = 0;
                local_120 = local_780;
                uVar78 = vmovmskps_avx(auVar118);
                uVar70 = 0;
                uVar72 = CONCAT44((int)((ulong)pRVar71 >> 0x20),uVar78);
                for (uVar19 = uVar72; _local_340 = *pauVar3, _local_320 = *pauVar1,
                    local_240 = local_720, local_200 = local_780, local_1dc = iVar9,
                    (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                  uVar70 = uVar70 + 1;
                }
                while (uVar72 != 0) {
                  uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_4a0 = local_160[uVar70];
                  local_490 = *(undefined4 *)((long)&local_140 + uVar70 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_120 + uVar70 * 4);
                  fVar99 = 1.0 - local_4a0;
                  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar99 * fVar99)),
                                            ZEXT416((uint)(local_4a0 * fVar99)),ZEXT416(0xc0000000))
                  ;
                  auVar11 = vfmsub132ss_fma(ZEXT416((uint)(local_4a0 * fVar99)),
                                            ZEXT416((uint)(local_4a0 * local_4a0)),
                                            ZEXT416(0x40000000));
                  auVar166 = ZEXT464(0x40400000);
                  fVar122 = auVar11._0_4_ * 3.0;
                  fVar97 = local_4a0 * local_4a0 * 3.0;
                  auVar154._0_4_ = fVar97 * (float)local_4e0._0_4_;
                  auVar154._4_4_ = fVar97 * (float)local_4e0._4_4_;
                  auVar154._8_4_ = fVar97 * fStack_4d8;
                  auVar154._12_4_ = fVar97 * fStack_4d4;
                  auVar128._4_4_ = fVar122;
                  auVar128._0_4_ = fVar122;
                  auVar128._8_4_ = fVar122;
                  auVar128._12_4_ = fVar122;
                  auVar11 = vfmadd132ps_fma(auVar128,auVar154,local_660);
                  fVar122 = auVar12._0_4_ * 3.0;
                  auVar144._4_4_ = fVar122;
                  auVar144._0_4_ = fVar122;
                  auVar144._8_4_ = fVar122;
                  auVar144._12_4_ = fVar122;
                  auVar11 = vfmadd132ps_fma(auVar144,auVar11,local_650);
                  fVar122 = fVar99 * fVar99 * -3.0;
                  local_630.context = context->user;
                  auVar129._4_4_ = fVar122;
                  auVar129._0_4_ = fVar122;
                  auVar129._8_4_ = fVar122;
                  auVar129._12_4_ = fVar122;
                  auVar11 = vfmadd132ps_fma(auVar129,auVar11,local_5b0);
                  local_4d0 = auVar11._0_4_;
                  local_4c0 = vshufps_avx(auVar11,auVar11,0x55);
                  local_4b0 = vshufps_avx(auVar11,auVar11,0xaa);
                  auVar135 = ZEXT1664(local_4b0);
                  local_480 = CONCAT44(uStack_2ec,local_2f0);
                  uStack_478 = CONCAT44(uStack_2e4,uStack_2e8);
                  local_470 = _local_5c0;
                  vpcmpeqd_avx2(ZEXT1632(_local_5c0),ZEXT1632(_local_5c0));
                  uStack_45c = (local_630.context)->instID[0];
                  local_460 = uStack_45c;
                  uStack_458 = uStack_45c;
                  uStack_454 = uStack_45c;
                  uStack_450 = (local_630.context)->instPrimID[0];
                  uStack_44c = uStack_450;
                  uStack_448 = uStack_450;
                  uStack_444 = uStack_450;
                  local_7a0 = *local_640;
                  local_630.valid = (int *)local_7a0;
                  local_630.geometryUserPtr = pGVar10->userPtr;
                  local_630.hit = (RTCHitN *)&local_4d0;
                  local_630.N = 4;
                  local_630.ray = (RTCRayN *)ray;
                  uStack_4cc = local_4d0;
                  uStack_4c8 = local_4d0;
                  uStack_4c4 = local_4d0;
                  fStack_49c = local_4a0;
                  fStack_498 = local_4a0;
                  fStack_494 = local_4a0;
                  uStack_48c = local_490;
                  uStack_488 = local_490;
                  uStack_484 = local_490;
                  if (pGVar10->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar135 = ZEXT1664(local_4b0);
                    auVar166 = ZEXT1664(auVar166._0_16_);
                    auVar198 = ZEXT1664(auVar198._0_16_);
                    (*pGVar10->occlusionFilterN)(&local_630);
                  }
                  if (local_7a0 == (undefined1  [16])0x0) {
                    auVar11 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar11 = auVar11 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var77 = context->args->filter;
                    if ((p_Var77 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar166 = ZEXT1664(auVar166._0_16_);
                      auVar198 = ZEXT1664(auVar198._0_16_);
                      (*p_Var77)(&local_630);
                    }
                    auVar12 = vpcmpeqd_avx(local_7a0,_DAT_01f45a50);
                    auVar11 = auVar12 ^ _DAT_01f46b70;
                    auVar130._8_4_ = 0xff800000;
                    auVar130._0_8_ = 0xff800000ff800000;
                    auVar130._12_4_ = 0xff800000;
                    auVar135 = ZEXT1664(auVar130);
                    auVar12 = vblendvps_avx(auVar130,*(undefined1 (*) [16])(local_630.ray + 0x80),
                                            auVar12);
                    *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar12;
                  }
                  auVar111._8_8_ = 0x100000001;
                  auVar111._0_8_ = 0x100000001;
                  if ((auVar111 & auVar11) != (undefined1  [16])0x0) {
                    pRVar71 = (RTCIntersectArguments *)0x1;
                    goto LAB_01151eb0;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar78;
                  uVar19 = uVar70 & 0x3f;
                  uVar70 = 0;
                  uVar72 = uVar72 ^ 1L << uVar19;
                  for (uVar19 = uVar72; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000
                      ) {
                    uVar70 = uVar70 + 1;
                  }
                }
                pRVar71 = (RTCIntersectArguments *)0x0;
LAB_01151eb0:
                auVar194 = ZEXT3264(local_720);
                auVar188 = ZEXT3264(local_780);
                auVar120 = ZEXT3264(local_700);
                auVar201 = ZEXT3264(local_6c0);
                auVar205 = ZEXT3264(local_760);
                auVar174 = ZEXT3264(CONCAT428(fStack_684,
                                              CONCAT424(fStack_688,
                                                        CONCAT420(fStack_68c,
                                                                  CONCAT416(fStack_690,
                                                                            CONCAT412(fStack_694,
                                                                                      CONCAT48(
                                                  fStack_698,CONCAT44(fStack_69c,local_6a0))))))));
                auVar177 = ZEXT3264(local_6e0);
                p_Var77 = (RTCFilterFunctionN)(ulong)(uint)local_5e0._0_4_;
              }
            }
            p_Var77 = (RTCFilterFunctionN)
                      CONCAT71((int7)((ulong)p_Var77 >> 8),(byte)p_Var77 | (byte)pRVar71);
          }
        }
        fVar211 = (float)local_680;
        fVar212 = local_680._4_4_;
        fVar97 = (float)uStack_678;
        fVar99 = uStack_678._4_4_;
        fVar101 = (float)uStack_670;
        fVar189 = uStack_670._4_4_;
        fVar190 = (float)uStack_668;
      }
    }
    if (((ulong)p_Var77 & 1) != 0) break;
    uVar78 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar86._4_4_ = uVar78;
    auVar86._0_4_ = uVar78;
    auVar86._8_4_ = uVar78;
    auVar86._12_4_ = uVar78;
    auVar11 = vcmpps_avx(local_2e0,auVar86,2);
    uVar73 = vmovmskps_avx(auVar11);
  }
  return uVar69 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }